

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_fma_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [24];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [32];
  float *in_RDI;
  int in_R8D;
  float fVar89;
  float fVar90;
  undefined1 auVar88 [32];
  __m128 _outp_1;
  __m128 _b_1;
  __m256 _outp;
  __m256 _b;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_rpow op;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z_1;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_2;
  v4si emm0;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23b0;
  undefined8 uStack_23a8;
  undefined8 local_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2310;
  undefined8 uStack_2308;
  int local_22fc;
  float local_22f8;
  undefined1 local_22f1 [5];
  int local_22ec;
  float *local_22e8;
  undefined1 (*local_22e0) [32];
  undefined1 (*local_22d0) [32];
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  float *local_2288;
  undefined1 (*local_2280) [32];
  undefined8 local_2270;
  undefined8 uStack_2268;
  float *local_2258;
  float local_2250;
  float fStack_224c;
  float fStack_2248;
  float fStack_2244;
  float local_2234;
  undefined8 local_2230;
  undefined8 uStack_2228;
  undefined8 *local_2218;
  undefined8 *local_2210;
  undefined1 *local_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined1 local_2160 [8];
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined1 local_2140 [32];
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined1 local_20e0 [32];
  undefined1 local_20c0 [8];
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined1 local_20a0 [8];
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined1 local_1f00 [8];
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  ulong uStack_1ee8;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  undefined1 local_1ec0 [32];
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [8];
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e60 [32];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined1 local_1e00 [8];
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined1 local_1d20 [32];
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  ulong uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined1 *local_1b58;
  float *local_1b50;
  undefined1 *local_1b48;
  undefined1 *local_1b40;
  float *local_1b38;
  undefined1 *local_1b30;
  float *local_1b28;
  undefined1 *local_1b20;
  undefined1 *local_1b18;
  float *local_1b10;
  undefined1 *local_1b08;
  undefined1 *local_1b00;
  float *local_1af8;
  undefined1 *local_1af0;
  undefined1 *local_1ae8;
  float *local_1ae0;
  undefined1 *local_1ad8;
  undefined1 *local_1ad0;
  float *local_1ac8;
  undefined1 *local_1ac0;
  undefined1 *local_1ab8;
  float *local_1ab0;
  undefined1 *local_1aa8;
  undefined1 *local_1aa0;
  float *local_1a98;
  undefined1 *local_1a90;
  undefined1 *local_1a88;
  float *local_1a80;
  undefined1 *local_1a78;
  undefined1 *local_1a70;
  undefined1 *local_1a68;
  undefined1 *local_1a60;
  undefined1 *local_1a58;
  float *local_1a50;
  undefined1 *local_1a48;
  undefined1 *local_1a40;
  float *local_1a38;
  undefined1 *local_1a30;
  undefined1 *local_1a28;
  float *local_1a20;
  undefined1 *local_1a18;
  undefined1 *local_1a10;
  float *local_1a08;
  undefined1 *local_1a00;
  undefined1 *local_19f8;
  float *local_19f0;
  undefined1 *local_19e8;
  undefined1 *local_19e0;
  float *local_19d8;
  float *local_19d0;
  undefined1 *local_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined1 *local_18a8;
  float *local_18a0;
  float *local_1898;
  undefined1 *local_1890;
  float *local_1888;
  undefined1 *local_1880;
  undefined1 *local_1878;
  float *local_1870;
  undefined1 *local_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 local_17b0;
  undefined8 uStack_17a8;
  undefined1 local_17a0 [16];
  undefined1 local_1790 [16];
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined1 local_16d0 [16];
  undefined1 local_16c0 [16];
  undefined4 local_16a4;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  float local_1660 [2];
  float afStack_1658 [2];
  float afStack_1650 [2];
  float afStack_1648 [2];
  float local_1640 [2];
  float afStack_1638 [2];
  float afStack_1630 [2];
  float afStack_1628 [2];
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  float local_1600 [2];
  float afStack_15f8 [2];
  float afStack_15f0 [2];
  float afStack_15e8 [2];
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  float local_15a0 [2];
  float afStack_1598 [2];
  float afStack_1590 [2];
  float afStack_1588 [2];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  float local_1540 [2];
  float afStack_1538 [2];
  float afStack_1530 [2];
  float afStack_1528 [2];
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14e0 [2];
  float afStack_14d8 [2];
  float afStack_14d0 [2];
  float afStack_14c8 [2];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  float local_1480 [2];
  float afStack_1478 [2];
  float afStack_1470 [2];
  float afStack_1468 [2];
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0 [2];
  float afStack_13b8 [2];
  float afStack_13b0 [2];
  float afStack_13a8 [2];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  float local_1360 [2];
  float afStack_1358 [2];
  float afStack_1350 [2];
  float afStack_1348 [2];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  float local_1300 [2];
  float afStack_12f8 [2];
  float afStack_12f0 [2];
  float afStack_12e8 [2];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  float local_12a0 [2];
  float afStack_1298 [2];
  float afStack_1290 [2];
  float afStack_1288 [2];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  float local_1240 [2];
  float afStack_1238 [2];
  float afStack_1230 [2];
  float afStack_1228 [2];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0 [2];
  float afStack_11d8 [2];
  float afStack_11d0 [2];
  float afStack_11c8 [2];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  float local_1180 [2];
  float afStack_1178 [2];
  float afStack_1170 [2];
  float afStack_1168 [2];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  float local_1120 [2];
  float afStack_1118 [2];
  float afStack_1110 [2];
  float afStack_1108 [2];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  ulong uStack_10a8;
  float local_10a0 [2];
  float afStack_1098 [2];
  float afStack_1090 [2];
  float afStack_1088 [2];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_1040 [2];
  float afStack_1038 [2];
  float afStack_1030 [2];
  float afStack_1028 [2];
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0 [2];
  float afStack_fd8 [2];
  float afStack_fd0 [2];
  float afStack_fc8 [2];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80 [2];
  float afStack_f78 [2];
  float afStack_f70 [2];
  float afStack_f68 [2];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20 [2];
  float afStack_f18 [2];
  float afStack_f10 [2];
  float afStack_f08 [2];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined4 local_e94;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined4 local_e74;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined1 local_df0 [16];
  undefined1 local_de0 [16];
  undefined4 local_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined4 local_bd4;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined4 local_bb4;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 *local_b58;
  undefined8 *local_b50;
  undefined1 *local_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined1 local_af0 [8];
  undefined8 uStack_ae8;
  undefined1 local_ae0 [16];
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [8];
  undefined8 uStack_aa8;
  undefined1 local_aa0 [8];
  undefined8 uStack_a98;
  undefined1 local_a90 [8];
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined4 local_954;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined1 local_940 [8];
  undefined8 uStack_938;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [8];
  undefined8 uStack_8f8;
  undefined1 local_8f0 [16];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [8];
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined4 local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined1 *local_648;
  float *local_640;
  float *local_638;
  undefined1 *local_630;
  float *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  float *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  float *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  float *local_5e0;
  undefined1 *local_5d8;
  float *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  float *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  float *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  float *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  float *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  float *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  float *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  float *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  float *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  float *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  float *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  float *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  float *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  float local_460 [2];
  float afStack_458 [2];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  float local_430 [2];
  float afStack_428 [2];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  float local_400 [2];
  float afStack_3f8 [2];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  float local_3e0 [2];
  float afStack_3d8 [2];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0 [2];
  float afStack_3a8 [2];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  float local_380 [2];
  float afStack_378 [2];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350 [2];
  float afStack_348 [2];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320 [2];
  float afStack_318 [2];
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float local_2c0 [2];
  float afStack_2b8 [2];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  float local_290 [2];
  float afStack_288 [2];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  float local_260 [2];
  float afStack_258 [2];
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230 [2];
  float afStack_228 [2];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_200 [2];
  float afStack_1f8 [2];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  float local_130 [2];
  float afStack_128 [2];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  float local_100 [2];
  float afStack_f8 [2];
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 (*local_48) [32];
  float *local_40;
  undefined1 *local_38;
  
  local_22f8 = *in_RDI;
  local_22fc = 0;
  if (in_R8D == 4) {
    local_23b0 = *(undefined8 *)in_RDI;
    uStack_23a8 = *(undefined8 *)(in_RDI + 2);
  }
  else {
    local_23b0 = CONCAT44(local_22f8,local_22f8);
    uStack_23a8 = CONCAT44(local_22f8,local_22f8);
    local_2250 = local_22f8;
    fStack_224c = local_22f8;
    fStack_2248 = local_22f8;
    fStack_2244 = local_22f8;
    local_2234 = local_22f8;
  }
  local_2310 = local_23b0;
  uStack_2308 = uStack_23a8;
  if (in_R8D == 8) {
    local_23e0 = *(undefined8 *)in_RDI;
    uStack_23d8 = *(undefined8 *)(in_RDI + 2);
    uStack_23d0 = *(undefined8 *)(in_RDI + 4);
    uStack_23c8 = *(undefined8 *)(in_RDI + 6);
  }
  else {
    local_2230 = local_23b0;
    uStack_2228 = uStack_23a8;
    local_23e0 = local_23b0;
    uStack_23d8 = uStack_23a8;
    uStack_23d0 = local_23b0;
    uStack_23c8 = uStack_23a8;
  }
  local_2340 = local_23e0;
  uStack_2338 = uStack_23d8;
  uStack_2330 = uStack_23d0;
  uStack_2328 = uStack_23c8;
  local_22e8 = in_RDX;
  local_22e0 = in_RSI;
  for (; local_22fc + 7 < in_ECX; local_22fc = local_22fc + 8) {
    local_22d0 = local_22e0;
    local_2360 = *(undefined8 *)*local_22e0;
    uStack_2358 = *(undefined8 *)(*local_22e0 + 8);
    uStack_2350 = *(undefined8 *)(*local_22e0 + 0x10);
    uStack_2348 = *(undefined8 *)(*local_22e0 + 0x18);
    local_2208 = local_22f1;
    local_2210 = &local_2340;
    local_2218 = &local_2360;
    local_2200 = local_23e0;
    uStack_21f8 = uStack_23d8;
    uStack_21f0 = uStack_23d0;
    uStack_21e8 = uStack_23c8;
    local_2120 = 0x3f8000003f800000;
    uStack_2118 = 0x3f8000003f800000;
    uStack_2110 = 0x3f8000003f800000;
    uStack_2108 = 0x3f8000003f800000;
    local_1ba0 = 0;
    uStack_1b98 = 0;
    uStack_1b90 = 0;
    uStack_1b88 = 0;
    local_1e60 = vcmpps_avx(*local_22e0,ZEXT1632(ZEXT816(0)),2);
    local_1e00 = SUB168(*(undefined1 (*) [16])*local_22e0,0);
    local_1bc0 = local_1e00;
    uStack_1df8 = SUB168(*(undefined1 (*) [16])*local_22e0,8);
    uStack_1bb8 = uStack_1df8;
    local_1be0 = 0x80000000800000;
    uStack_1bd8 = 0x80000000800000;
    uStack_1bd0 = 0x80000000800000;
    uStack_1bc8 = 0x80000000800000;
    auVar22._8_8_ = 0x80000000800000;
    auVar22._0_8_ = 0x80000000800000;
    auVar22._16_8_ = 0x80000000800000;
    auVar22._24_8_ = 0x80000000800000;
    auVar1 = vmaxps_avx(*local_22e0,auVar22);
    local_1e00 = auVar1._0_8_;
    local_da0 = local_1e00;
    uStack_1df8 = auVar1._8_8_;
    uStack_d98 = uStack_1df8;
    uStack_1df0 = auVar1._16_8_;
    uStack_d90 = uStack_1df0;
    uStack_1de8 = auVar1._24_8_;
    uStack_d88 = uStack_1de8;
    local_dc0 = local_1e00;
    uStack_db8 = uStack_1df8;
    uStack_db0 = uStack_1df0;
    uStack_da8 = uStack_1de8;
    local_dc4 = 0x17;
    local_e40 = local_1e00;
    uStack_e38 = uStack_1df8;
    uStack_e30 = uStack_1df0;
    uStack_e28 = uStack_1de8;
    local_bb0 = local_1e00;
    uStack_ba8 = uStack_1df8;
    local_bb4 = 0x17;
    local_de0 = vpsrld_avx(auVar1._0_16_,ZEXT416(0x17));
    local_bd0 = uStack_1df0;
    uStack_bc8 = uStack_1de8;
    local_bd4 = 0x17;
    local_df0 = vpsrld_avx(auVar1._16_16_,ZEXT416(0x17));
    local_e60 = local_de0._0_8_;
    uStack_e58 = local_de0._8_8_;
    uStack_e50 = local_df0._0_8_;
    uStack_e48 = local_df0._8_8_;
    local_e20 = local_de0._0_8_;
    uStack_e18 = local_de0._8_8_;
    uStack_e10 = local_df0._0_8_;
    uStack_e08 = local_df0._8_8_;
    local_1920 = local_1e00;
    uStack_1918 = uStack_1df8;
    uStack_1910 = uStack_1df0;
    uStack_1908 = uStack_1de8;
    local_1940 = 0x807fffff807fffff;
    uStack_1938 = 0x807fffff807fffff;
    uStack_1930 = 0x807fffff807fffff;
    uStack_1928 = 0x807fffff807fffff;
    auVar24._8_8_ = 0x807fffff807fffff;
    auVar24._0_8_ = 0x807fffff807fffff;
    auVar24._16_8_ = 0x807fffff807fffff;
    auVar24._24_8_ = 0x807fffff807fffff;
    auVar1 = vandps_avx(auVar1,auVar24);
    local_1e00 = auVar1._0_8_;
    local_d20 = local_1e00;
    uStack_1df8 = auVar1._8_8_;
    uStack_d18 = uStack_1df8;
    uStack_1df0 = auVar1._16_8_;
    uStack_d10 = uStack_1df0;
    uStack_1de8 = auVar1._24_8_;
    uStack_d08 = uStack_1de8;
    local_d40 = 0x3f0000003f000000;
    uStack_d38 = 0x3f0000003f000000;
    uStack_d30 = 0x3f0000003f000000;
    uStack_d28 = 0x3f0000003f000000;
    auVar48._8_8_ = 0x3f0000003f000000;
    auVar48._0_8_ = 0x3f0000003f000000;
    auVar48._16_8_ = 0x3f0000003f000000;
    auVar48._24_8_ = 0x3f0000003f000000;
    auVar2 = vorps_avx(auVar1,auVar48);
    local_c20 = local_de0._0_8_;
    uStack_c18 = local_de0._8_8_;
    uStack_c10 = local_df0._0_8_;
    uStack_c08 = local_df0._8_8_;
    local_1780 = 0x7f0000007f;
    uStack_1778 = 0x7f0000007f;
    uStack_1770 = 0x7f0000007f;
    uStack_1768 = 0x7f0000007f;
    local_cc0 = local_de0._0_8_;
    uStack_cb8 = local_de0._8_8_;
    uStack_cb0 = local_df0._0_8_;
    uStack_ca8 = local_df0._8_8_;
    local_ce0 = 0x7f0000007f;
    uStack_cd8 = 0x7f0000007f;
    uStack_cd0 = 0x7f0000007f;
    uStack_cc8 = 0x7f0000007f;
    local_c70 = 0x7f0000007f;
    uStack_c68 = 0x7f0000007f;
    local_c80 = 0x7f0000007f;
    uStack_c78 = 0x7f0000007f;
    local_b70 = local_de0._0_8_;
    uStack_b68 = local_de0._8_8_;
    local_b80 = 0x7f0000007f;
    uStack_b78 = 0x7f0000007f;
    auVar50._8_8_ = 0x7f0000007f;
    auVar50._0_8_ = 0x7f0000007f;
    local_c50 = vpsubd_avx(local_de0,auVar50);
    local_b90 = local_df0._0_8_;
    uStack_b88 = local_df0._8_8_;
    local_ba0 = 0x7f0000007f;
    uStack_b98 = 0x7f0000007f;
    auVar4._8_8_ = 0x7f0000007f;
    auVar4._0_8_ = 0x7f0000007f;
    local_c60 = vpsubd_avx(local_df0,auVar4);
    local_d00 = local_c50._0_8_;
    uStack_cf8 = local_c50._8_8_;
    uStack_cf0 = local_c60._0_8_;
    uStack_ce8 = local_c60._8_8_;
    local_ca0 = local_c50._0_8_;
    uStack_c98 = local_c50._8_8_;
    uStack_c90 = local_c60._0_8_;
    uStack_c88 = local_c60._8_8_;
    local_1e20 = local_c50._0_8_;
    uStack_1e18 = local_c50._8_8_;
    uStack_1e10 = local_c60._0_8_;
    uStack_1e08 = local_c60._8_8_;
    local_c00 = local_c50._0_8_;
    uStack_bf8 = local_c50._8_8_;
    uStack_bf0 = local_c60._0_8_;
    uStack_be8 = local_c60._8_8_;
    auVar49._16_8_ = local_c60._0_8_;
    auVar49._0_16_ = local_c50;
    auVar49._24_8_ = local_c60._8_8_;
    auVar1 = vcvtdq2ps_avx(auVar49);
    local_1e80 = auVar1._0_8_;
    uVar6 = local_1e80;
    uStack_1e78 = auVar1._8_8_;
    uVar7 = uStack_1e78;
    uStack_1e70 = auVar1._16_8_;
    uVar8 = uStack_1e70;
    uStack_1e68 = auVar1._24_8_;
    uVar9 = uStack_1e68;
    local_1d60 = 0x3f8000003f800000;
    uStack_1d58 = 0x3f8000003f800000;
    uStack_1d50 = 0x3f8000003f800000;
    uStack_1d48 = 0x3f8000003f800000;
    local_1d40._0_4_ = auVar1._0_4_;
    local_1d40._4_4_ = auVar1._4_4_;
    uStack_1d38._0_4_ = auVar1._8_4_;
    uStack_1d38._4_4_ = auVar1._12_4_;
    uStack_1d30._0_4_ = auVar1._16_4_;
    uStack_1d30._4_4_ = auVar1._20_4_;
    uStack_1d28._0_4_ = auVar1._24_4_;
    uStack_1d28._4_4_ = auVar1._28_4_;
    local_1e80._4_4_ = local_1d40._4_4_ + 1.0;
    local_1e80._0_4_ = (float)local_1d40 + 1.0;
    uStack_1e78._0_4_ = (float)uStack_1d38 + 1.0;
    uStack_1e78._4_4_ = uStack_1d38._4_4_ + 1.0;
    uStack_1e70._0_4_ = (float)uStack_1d30 + 1.0;
    uStack_1e70._4_4_ = uStack_1d30._4_4_ + 1.0;
    auVar87 = _local_1e80;
    uStack_1e68._0_4_ = (float)uStack_1d28 + 1.0;
    uStack_1e68._4_4_ = uStack_1d28._4_4_ + 1.0;
    auVar88 = _local_1e80;
    local_1ea0 = vcmpps_avx(auVar2,_DAT_01f94420,1);
    local_1e00 = auVar2._0_8_;
    local_1960 = local_1e00;
    uStack_1df8 = auVar2._8_8_;
    uStack_1958 = uStack_1df8;
    uStack_1df0 = auVar2._16_8_;
    uStack_1950 = uStack_1df0;
    uStack_1de8 = auVar2._24_8_;
    uStack_1948 = uStack_1de8;
    local_1980 = local_1ea0._0_8_;
    uStack_1978 = local_1ea0._8_8_;
    uStack_1970 = local_1ea0._16_8_;
    uStack_1968 = local_1ea0._24_8_;
    local_1ec0 = vandps_avx(auVar2,local_1ea0);
    local_1cc0 = local_1e00;
    uStack_1cb8 = uStack_1df8;
    uStack_1cb0 = uStack_1df0;
    uStack_1ca8 = uStack_1de8;
    local_1ce0 = 0x3f8000003f800000;
    uStack_1cd8 = 0x3f8000003f800000;
    uStack_1cd0 = 0x3f8000003f800000;
    uStack_1cc8 = 0x3f8000003f800000;
    auVar21._8_8_ = 0x3f8000003f800000;
    auVar21._0_8_ = 0x3f8000003f800000;
    auVar21._16_8_ = 0x3f8000003f800000;
    auVar21._24_8_ = 0x3f8000003f800000;
    auVar1 = vsubps_avx(auVar2,auVar21);
    local_1d00 = local_1e80;
    uStack_1cf8 = uStack_1e78;
    uStack_1e70 = auVar87._16_8_;
    uStack_1cf0 = uStack_1e70;
    uStack_1e68 = auVar88._24_8_;
    uStack_1ce8 = uStack_1e68;
    local_19a0 = 0x3f8000003f800000;
    uStack_1998 = 0x3f8000003f800000;
    uStack_1990 = 0x3f8000003f800000;
    uStack_1988 = 0x3f8000003f800000;
    local_19c0 = local_1ea0._0_8_;
    uStack_19b8 = local_1ea0._8_8_;
    uStack_19b0 = local_1ea0._16_8_;
    uStack_19a8 = local_1ea0._24_8_;
    auVar23._8_8_ = 0x3f8000003f800000;
    auVar23._0_8_ = 0x3f8000003f800000;
    auVar23._16_8_ = 0x3f8000003f800000;
    auVar23._24_8_ = 0x3f8000003f800000;
    local_1d20 = vandps_avx(auVar23,local_1ea0);
    auVar20._16_8_ = uStack_1e70;
    auVar20._0_16_ = _local_1e80;
    auVar20._24_8_ = uStack_1e68;
    _local_1e80 = vsubps_avx(auVar20,local_1d20);
    local_1e00 = auVar1._0_8_;
    uVar10 = local_1e00;
    uStack_1df8 = auVar1._8_8_;
    uVar11 = uStack_1df8;
    uStack_1df0 = auVar1._16_8_;
    uVar12 = uStack_1df0;
    uStack_1de8 = auVar1._24_8_;
    uVar13 = uStack_1de8;
    local_1d80._0_4_ = auVar1._0_4_;
    local_1d80._4_4_ = auVar1._4_4_;
    uStack_1d78._0_4_ = auVar1._8_4_;
    uStack_1d78._4_4_ = auVar1._12_4_;
    uStack_1d70._0_4_ = auVar1._16_4_;
    uStack_1d70._4_4_ = auVar1._20_4_;
    uStack_1d68._0_4_ = auVar1._24_4_;
    uStack_1d68._4_4_ = auVar1._28_4_;
    local_1da0._0_4_ = local_1ec0._0_4_;
    local_1da0._4_4_ = local_1ec0._4_4_;
    uStack_1d98._0_4_ = local_1ec0._8_4_;
    uStack_1d98._4_4_ = local_1ec0._12_4_;
    uStack_1d90._0_4_ = local_1ec0._16_4_;
    uStack_1d90._4_4_ = local_1ec0._20_4_;
    uStack_1d88._0_4_ = local_1ec0._24_4_;
    uStack_1d88._4_4_ = local_1ec0._28_4_;
    local_1e00._0_4_ = (float)local_1d80 + (float)local_1da0;
    local_1e00._4_4_ = local_1d80._4_4_ + local_1da0._4_4_;
    uStack_1d78._0_4_ = (float)uStack_1d78 + (float)uStack_1d98;
    uStack_1d78._4_4_ = uStack_1d78._4_4_ + uStack_1d98._4_4_;
    uStack_1d70._0_4_ = (float)uStack_1d70 + (float)uStack_1d90;
    uStack_1d70._4_4_ = uStack_1d70._4_4_ + uStack_1d90._4_4_;
    uStack_1d68._0_4_ = (float)uStack_1d68 + (float)uStack_1d88;
    fStack_1ec4 = uStack_1d68._4_4_ + uStack_1d88._4_4_;
    uStack_1df8._0_4_ = (float)uStack_1d78;
    uStack_1df8._4_4_ = uStack_1d78._4_4_;
    uStack_1df0._0_4_ = (float)uStack_1d70;
    uStack_1df0._4_4_ = uStack_1d70._4_4_;
    auVar87 = _local_1e00;
    uStack_1de8._0_4_ = (float)uStack_1d68;
    uStack_1de8._4_4_ = fStack_1ec4;
    auVar1 = _local_1e00;
    local_1c20 = local_1e00;
    uStack_1c18 = uStack_1df8;
    uStack_1df0 = auVar87._16_8_;
    uStack_1c10 = uStack_1df0;
    uStack_1de8 = auVar1._24_8_;
    uStack_1c08 = uStack_1de8;
    local_1ee0 = (float)local_1e00._0_4_ * (float)local_1e00._0_4_;
    fStack_1edc = (float)local_1e00._4_4_ * (float)local_1e00._4_4_;
    fStack_1ed8 = (float)uStack_1d78 * (float)uStack_1d78;
    fStack_1ed4 = uStack_1d78._4_4_ * uStack_1d78._4_4_;
    fStack_1ed0 = (float)uStack_1d70 * (float)uStack_1d70;
    fStack_1ecc = uStack_1d70._4_4_ * uStack_1d70._4_4_;
    fStack_1ec8 = (float)uStack_1d68 * (float)uStack_1d68;
    uStack_1ef8 = 0x3d9021bb3d9021bb;
    local_1f00 = (undefined1  [8])0x3d9021bb3d9021bb;
    uStack_1ef0 = 0x3d9021bb3d9021bb;
    uStack_1ee8 = 0x3d9021bb3d9021bb;
    local_1b40 = local_1f00;
    local_1b58 = local_1e00;
    local_1a80 = ::_ps256_cephes_log_p1;
    local_1380 = 0x3d9021bb3d9021bb;
    uStack_1378 = 0x3d9021bb3d9021bb;
    uStack_1370 = 0x3d9021bb3d9021bb;
    uStack_1368 = 0x3d9021bb3d9021bb;
    local_13a0 = local_1e00;
    uStack_1398 = uStack_1df8;
    uStack_1390 = uStack_1df0;
    uStack_1388 = uStack_1de8;
    local_13c0[0] = -0.1151461;
    local_13c0[1] = -0.1151461;
    afStack_13b8[0] = -0.1151461;
    afStack_13b8[1] = -0.1151461;
    afStack_13b0[0] = -0.1151461;
    afStack_13b0[1] = -0.1151461;
    afStack_13a8[0] = -0.1151461;
    afStack_13a8[1] = -0.1151461;
    auVar33._8_4_ = -0.1151461;
    auVar33._12_4_ = -0.1151461;
    auVar33._0_4_ = -0.1151461;
    auVar33._4_4_ = -0.1151461;
    auVar33._16_4_ = -0.1151461;
    auVar33._20_4_ = -0.1151461;
    auVar33._24_4_ = -0.1151461;
    auVar33._28_4_ = -0.1151461;
    auVar4 = vfmadd213ps_fma(auVar1,_local_1f00,auVar33);
    local_1a98 = ::_ps256_cephes_log_p2;
    local_1f00 = auVar4._0_8_;
    local_1320 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uStack_1318 = uStack_1ef8;
    uStack_1310 = 0;
    uStack_1308 = 0;
    local_1340 = local_1e00;
    uStack_1338 = uStack_1df8;
    uStack_1330 = uStack_1df0;
    uStack_1328 = uStack_1de8;
    local_1360[0] = 0.116769984;
    local_1360[1] = 0.116769984;
    afStack_1358[0] = 0.116769984;
    afStack_1358[1] = 0.116769984;
    afStack_1350[0] = 0.116769984;
    afStack_1350[1] = 0.116769984;
    afStack_1348[0] = 0.116769984;
    afStack_1348[1] = 0.116769984;
    auVar34._8_4_ = 0.116769984;
    auVar34._12_4_ = 0.116769984;
    auVar34._0_4_ = 0.116769984;
    auVar34._4_4_ = 0.116769984;
    auVar34._16_4_ = 0.116769984;
    auVar34._20_4_ = 0.116769984;
    auVar34._24_4_ = 0.116769984;
    auVar34._28_4_ = 0.116769984;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar34);
    local_1ab0 = ::_ps256_cephes_log_p3;
    local_1f00 = auVar4._0_8_;
    local_12c0 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uStack_12b8 = uStack_1ef8;
    uStack_12b0 = 0;
    uStack_12a8 = 0;
    local_12e0 = local_1e00;
    uStack_12d8 = uStack_1df8;
    uStack_12d0 = uStack_1df0;
    uStack_12c8 = uStack_1de8;
    local_1300[0] = -0.12420141;
    local_1300[1] = -0.12420141;
    afStack_12f8[0] = -0.12420141;
    afStack_12f8[1] = -0.12420141;
    afStack_12f0[0] = -0.12420141;
    afStack_12f0[1] = -0.12420141;
    afStack_12e8[0] = -0.12420141;
    afStack_12e8[1] = -0.12420141;
    auVar35._8_4_ = -0.12420141;
    auVar35._12_4_ = -0.12420141;
    auVar35._0_4_ = -0.12420141;
    auVar35._4_4_ = -0.12420141;
    auVar35._16_4_ = -0.12420141;
    auVar35._20_4_ = -0.12420141;
    auVar35._24_4_ = -0.12420141;
    auVar35._28_4_ = -0.12420141;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar35);
    local_1ac8 = ::_ps256_cephes_log_p4;
    local_1f00 = auVar4._0_8_;
    local_1260 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uStack_1258 = uStack_1ef8;
    uStack_1250 = 0;
    uStack_1248 = 0;
    local_1280 = local_1e00;
    uStack_1278 = uStack_1df8;
    uStack_1270 = uStack_1df0;
    uStack_1268 = uStack_1de8;
    local_12a0[0] = 0.14249323;
    local_12a0[1] = 0.14249323;
    afStack_1298[0] = 0.14249323;
    afStack_1298[1] = 0.14249323;
    afStack_1290[0] = 0.14249323;
    afStack_1290[1] = 0.14249323;
    afStack_1288[0] = 0.14249323;
    afStack_1288[1] = 0.14249323;
    auVar36._8_4_ = 0.14249323;
    auVar36._12_4_ = 0.14249323;
    auVar36._0_4_ = 0.14249323;
    auVar36._4_4_ = 0.14249323;
    auVar36._16_4_ = 0.14249323;
    auVar36._20_4_ = 0.14249323;
    auVar36._24_4_ = 0.14249323;
    auVar36._28_4_ = 0.14249323;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar36);
    local_1ae0 = ::_ps256_cephes_log_p5;
    local_1f00 = auVar4._0_8_;
    local_1200 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uStack_11f8 = uStack_1ef8;
    uStack_11f0 = 0;
    uStack_11e8 = 0;
    local_1220 = local_1e00;
    uStack_1218 = uStack_1df8;
    uStack_1210 = uStack_1df0;
    uStack_1208 = uStack_1de8;
    local_1240[0] = -0.16668057;
    local_1240[1] = -0.16668057;
    afStack_1238[0] = -0.16668057;
    afStack_1238[1] = -0.16668057;
    afStack_1230[0] = -0.16668057;
    afStack_1230[1] = -0.16668057;
    afStack_1228[0] = -0.16668057;
    afStack_1228[1] = -0.16668057;
    auVar37._8_4_ = -0.16668057;
    auVar37._12_4_ = -0.16668057;
    auVar37._0_4_ = -0.16668057;
    auVar37._4_4_ = -0.16668057;
    auVar37._16_4_ = -0.16668057;
    auVar37._20_4_ = -0.16668057;
    auVar37._24_4_ = -0.16668057;
    auVar37._28_4_ = -0.16668057;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar37);
    local_1af8 = ::_ps256_cephes_log_p6;
    local_1f00 = auVar4._0_8_;
    local_11a0 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uStack_1198 = uStack_1ef8;
    uStack_1190 = 0;
    uStack_1188 = 0;
    local_11c0 = local_1e00;
    uStack_11b8 = uStack_1df8;
    uStack_11b0 = uStack_1df0;
    uStack_11a8 = uStack_1de8;
    local_11e0[0] = 0.20000714;
    local_11e0[1] = 0.20000714;
    afStack_11d8[0] = 0.20000714;
    afStack_11d8[1] = 0.20000714;
    afStack_11d0[0] = 0.20000714;
    afStack_11d0[1] = 0.20000714;
    afStack_11c8[0] = 0.20000714;
    afStack_11c8[1] = 0.20000714;
    auVar38._8_4_ = 0.20000714;
    auVar38._12_4_ = 0.20000714;
    auVar38._0_4_ = 0.20000714;
    auVar38._4_4_ = 0.20000714;
    auVar38._16_4_ = 0.20000714;
    auVar38._20_4_ = 0.20000714;
    auVar38._24_4_ = 0.20000714;
    auVar38._28_4_ = 0.20000714;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar38);
    local_1b10 = ::_ps256_cephes_log_p7;
    local_1f00 = auVar4._0_8_;
    local_1140 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uStack_1138 = uStack_1ef8;
    uStack_1130 = 0;
    uStack_1128 = 0;
    local_1160 = local_1e00;
    uStack_1158 = uStack_1df8;
    uStack_1150 = uStack_1df0;
    uStack_1148 = uStack_1de8;
    local_1180[0] = -0.24999994;
    local_1180[1] = -0.24999994;
    afStack_1178[0] = -0.24999994;
    afStack_1178[1] = -0.24999994;
    afStack_1170[0] = -0.24999994;
    afStack_1170[1] = -0.24999994;
    afStack_1168[0] = -0.24999994;
    afStack_1168[1] = -0.24999994;
    auVar39._8_4_ = -0.24999994;
    auVar39._12_4_ = -0.24999994;
    auVar39._0_4_ = -0.24999994;
    auVar39._4_4_ = -0.24999994;
    auVar39._16_4_ = -0.24999994;
    auVar39._20_4_ = -0.24999994;
    auVar39._24_4_ = -0.24999994;
    auVar39._28_4_ = -0.24999994;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar39);
    local_1b28 = ::_ps256_cephes_log_p8;
    local_1f00 = auVar4._0_8_;
    local_10e0 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uStack_10d8 = uStack_1ef8;
    uStack_10d0 = 0;
    uStack_10c8 = 0;
    local_1100 = local_1e00;
    uStack_10f8 = uStack_1df8;
    uStack_10f0 = uStack_1df0;
    uStack_10e8 = uStack_1de8;
    local_1120[0] = 0.3333333;
    local_1120[1] = 0.3333333;
    afStack_1118[0] = 0.3333333;
    afStack_1118[1] = 0.3333333;
    afStack_1110[0] = 0.3333333;
    afStack_1110[1] = 0.3333333;
    afStack_1108[0] = 0.3333333;
    afStack_1108[1] = 0.3333333;
    auVar40._8_4_ = 0.3333333;
    auVar40._12_4_ = 0.3333333;
    auVar40._0_4_ = 0.3333333;
    auVar40._4_4_ = 0.3333333;
    auVar40._16_4_ = 0.3333333;
    auVar40._20_4_ = 0.3333333;
    auVar40._24_4_ = 0.3333333;
    auVar40._28_4_ = 0.3333333;
    auVar4 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar4),auVar40);
    local_1f00 = auVar4._0_8_;
    uVar14 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uVar15 = uStack_1ef8;
    uStack_1c30 = 0;
    uStack_1c28 = 0;
    local_1c60 = local_1e00;
    uStack_1c58 = uStack_1df8;
    uStack_1c50 = uStack_1df0;
    uStack_1c48 = uStack_1de8;
    local_1c40._0_4_ = auVar4._0_4_;
    local_1c40._4_4_ = auVar4._4_4_;
    uStack_1c38._0_4_ = auVar4._8_4_;
    uStack_1c38._4_4_ = auVar4._12_4_;
    local_1f00._4_4_ = local_1c40._4_4_ * (float)local_1e00._4_4_;
    local_1f00._0_4_ = (float)local_1c40 * (float)local_1e00._0_4_;
    uStack_1ef8._0_4_ = (float)uStack_1c38 * (float)uStack_1d78;
    uStack_1ef8._4_4_ = uStack_1c38._4_4_ * uStack_1d78._4_4_;
    uStack_1ef0._0_4_ = (float)uStack_1d70 * 0.0;
    uStack_1ef0._4_4_ = uStack_1d70._4_4_ * 0.0;
    auVar87 = _local_1f00;
    local_1c80 = local_1f00;
    uStack_1c78 = uStack_1ef8;
    uStack_1ef0 = auVar87._16_8_;
    uStack_1c70 = uStack_1ef0;
    uStack_1ee8 = (ulong)(uint)((float)uStack_1d68 * 0.0);
    uStack_1c68 = uStack_1ee8;
    local_1ca0 = CONCAT44(fStack_1edc,local_1ee0);
    uStack_1c98 = CONCAT44(fStack_1ed4,fStack_1ed8);
    uStack_1c90 = CONCAT44(fStack_1ecc,fStack_1ed0);
    uStack_1c88 = CONCAT44(fStack_1ec4,fStack_1ec8);
    uStack_1ee8._0_4_ = (float)uStack_1d68 * 0.0 * fStack_1ec8;
    local_1f00._4_4_ = local_1c40._4_4_ * (float)local_1e00._4_4_ * fStack_1edc;
    local_1f00._0_4_ = (float)local_1c40 * (float)local_1e00._0_4_ * local_1ee0;
    uStack_1ef8._0_4_ = (float)uStack_1c38 * (float)uStack_1d78 * fStack_1ed8;
    uStack_1ef8._4_4_ = uStack_1c38._4_4_ * uStack_1d78._4_4_ * fStack_1ed4;
    uStack_1ef0._0_4_ = (float)uStack_1d70 * 0.0 * fStack_1ed0;
    uStack_1ef0._4_4_ = uStack_1d70._4_4_ * 0.0 * fStack_1ecc;
    auVar87 = _local_1f00;
    uStack_1ee8._4_4_ = 0;
    auVar1 = _local_1f00;
    local_1b48 = local_1e80;
    local_1b38 = ::_ps256_cephes_log_q1;
    local_1080 = local_1e80;
    uStack_1078 = uStack_1e78;
    uStack_1070 = uStack_1e70;
    uStack_1068 = uStack_1e68;
    local_10a0[0] = -0.00021219444;
    local_10a0[1] = -0.00021219444;
    afStack_1098[0] = -0.00021219444;
    afStack_1098[1] = -0.00021219444;
    afStack_1090[0] = -0.00021219444;
    afStack_1090[1] = -0.00021219444;
    afStack_1088[0] = -0.00021219444;
    afStack_1088[1] = -0.00021219444;
    local_10c0 = local_1f00;
    uStack_10b8 = uStack_1ef8;
    uStack_1ef0 = auVar87._16_8_;
    uStack_10b0 = uStack_1ef0;
    uStack_1ee8 = (ulong)(uint)(float)uStack_1ee8;
    uStack_10a8 = uStack_1ee8;
    auVar41._8_4_ = -0.00021219444;
    auVar41._12_4_ = -0.00021219444;
    auVar41._0_4_ = -0.00021219444;
    auVar41._4_4_ = -0.00021219444;
    auVar41._16_4_ = -0.00021219444;
    auVar41._20_4_ = -0.00021219444;
    auVar41._24_4_ = -0.00021219444;
    auVar41._28_4_ = -0.00021219444;
    auVar4 = vfmadd213ps_fma(auVar41,_local_1e80,auVar1);
    local_1898 = &local_1ee0;
    local_18a0 = ::_ps256_0p5;
    local_f00 = CONCAT44(fStack_1edc,local_1ee0);
    uStack_ef8 = CONCAT44(fStack_1ed4,fStack_1ed8);
    uStack_ef0 = CONCAT44(fStack_1ecc,fStack_1ed0);
    uStack_ee8 = CONCAT44(fStack_1ec4,fStack_1ec8);
    auVar85._4_4_ = fStack_1edc;
    auVar85._0_4_ = local_1ee0;
    auVar85._8_4_ = fStack_1ed8;
    auVar85._12_4_ = fStack_1ed4;
    auVar85._16_4_ = fStack_1ed0;
    auVar85._20_4_ = fStack_1ecc;
    auVar85._24_4_ = fStack_1ec8;
    auVar85._28_4_ = fStack_1ec4;
    local_f20[0] = 0.5;
    local_f20[1] = 0.5;
    afStack_f18[0] = 0.5;
    afStack_f18[1] = 0.5;
    afStack_f10[0] = 0.5;
    afStack_f10[1] = 0.5;
    afStack_f08[0] = 0.5;
    afStack_f08[1] = 0.5;
    local_1f00 = auVar4._0_8_;
    local_f40 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uStack_f38 = uStack_1ef8;
    uStack_f30 = 0;
    uStack_f28 = 0;
    auVar45._8_4_ = 0.5;
    auVar45._12_4_ = 0.5;
    auVar45._0_4_ = 0.5;
    auVar45._4_4_ = 0.5;
    auVar45._16_4_ = 0.5;
    auVar45._20_4_ = 0.5;
    auVar45._24_4_ = 0.5;
    auVar45._28_4_ = 0.5;
    auVar4 = vfnmadd213ps_fma(auVar45,auVar85,ZEXT1632(auVar4));
    local_1dc0 = local_1e00;
    uStack_1db8 = uStack_1df8;
    uStack_1db0 = uStack_1df0;
    uStack_1da8 = uStack_1de8;
    local_1f00 = auVar4._0_8_;
    uVar16 = local_1f00;
    uStack_1ef8 = auVar4._8_8_;
    uVar17 = uStack_1ef8;
    uStack_1dd0 = 0;
    uStack_1dc8 = 0;
    local_1de0._0_4_ = auVar4._0_4_;
    local_1de0._4_4_ = auVar4._4_4_;
    uStack_1dd8._0_4_ = auVar4._8_4_;
    uStack_1dd8._4_4_ = auVar4._12_4_;
    local_1e00._4_4_ = (float)local_1e00._4_4_ + local_1de0._4_4_;
    local_1e00._0_4_ = (float)local_1e00._0_4_ + (float)local_1de0;
    uStack_1df8._0_4_ = (float)uStack_1d78 + (float)uStack_1dd8;
    uStack_1df8._4_4_ = uStack_1d78._4_4_ + uStack_1dd8._4_4_;
    uStack_1df0._0_4_ = (float)uStack_1d70 + 0.0;
    uStack_1df0._4_4_ = uStack_1d70._4_4_ + 0.0;
    auVar87 = _local_1e00;
    uStack_1de8._0_4_ = (float)uStack_1d68 + 0.0;
    uStack_1de8._4_4_ = fStack_1ec4 + 0.0;
    auVar1 = _local_1e00;
    local_1b50 = ::_ps256_cephes_log_q2;
    local_1020 = local_1e80;
    uStack_1018 = uStack_1e78;
    uStack_1010 = uStack_1e70;
    uStack_1008 = uStack_1e68;
    local_1040[0] = 0.6933594;
    local_1040[1] = 0.6933594;
    afStack_1038[0] = 0.6933594;
    afStack_1038[1] = 0.6933594;
    afStack_1030[0] = 0.6933594;
    afStack_1030[1] = 0.6933594;
    afStack_1028[0] = 0.6933594;
    afStack_1028[1] = 0.6933594;
    local_1060 = local_1e00;
    uStack_1058 = uStack_1df8;
    uStack_1df0 = auVar87._16_8_;
    uStack_1050 = uStack_1df0;
    uStack_1de8 = auVar1._24_8_;
    uStack_1048 = uStack_1de8;
    auVar42._8_4_ = 0.6933594;
    auVar42._12_4_ = 0.6933594;
    auVar42._0_4_ = 0.6933594;
    auVar42._4_4_ = 0.6933594;
    auVar42._16_4_ = 0.6933594;
    auVar42._20_4_ = 0.6933594;
    auVar42._24_4_ = 0.6933594;
    auVar42._28_4_ = 0.6933594;
    auVar4 = vfmadd213ps_fma(auVar42,_local_1e80,auVar1);
    local_1e00 = auVar4._0_8_;
    local_d60 = local_1e00;
    uStack_1df8 = auVar4._8_8_;
    uStack_d58 = uStack_1df8;
    uStack_d50 = 0;
    uStack_d48 = 0;
    local_d80 = local_1e60._0_8_;
    uStack_d78 = local_1e60._8_8_;
    uStack_d70 = local_1e60._16_8_;
    uStack_d68 = local_1e60._24_8_;
    _local_1f00 = vorps_avx(ZEXT1632(auVar4),local_1e60);
    local_21a0._0_4_ = (float)local_23e0;
    local_21a0._4_4_ = (float)((ulong)local_23e0 >> 0x20);
    uStack_2198._0_4_ = (float)uStack_23d8;
    uStack_2198._4_4_ = (float)((ulong)uStack_23d8 >> 0x20);
    uStack_2190._0_4_ = (float)uStack_23d0;
    uStack_2190._4_4_ = (float)((ulong)uStack_23d0 >> 0x20);
    uStack_2188._0_4_ = (float)uStack_23c8;
    uStack_2188._4_4_ = (undefined4)((ulong)uStack_23c8 >> 0x20);
    local_21c0._0_4_ = local_1f00._0_4_;
    local_21c0._4_4_ = local_1f00._4_4_;
    uStack_21b8._0_4_ = local_1f00._8_4_;
    uStack_21b8._4_4_ = local_1f00._12_4_;
    uStack_21b0._0_4_ = local_1f00._16_4_;
    uStack_21b0._4_4_ = local_1f00._20_4_;
    uStack_21a8._0_4_ = local_1f00._24_4_;
    local_20a0._4_4_ = local_21a0._4_4_ * local_21c0._4_4_;
    local_20a0._0_4_ = (float)local_21a0 * (float)local_21c0;
    uStack_2098._0_4_ = (float)uStack_2198 * (float)uStack_21b8;
    uStack_2098._4_4_ = uStack_2198._4_4_ * uStack_21b8._4_4_;
    uStack_2090._0_4_ = (float)uStack_2190 * (float)uStack_21b0;
    uStack_2090._4_4_ = uStack_2190._4_4_ * uStack_21b0._4_4_;
    auVar87 = _local_20a0;
    uStack_2088._0_4_ = (float)uStack_2188 * (float)uStack_21a8;
    uStack_2088._4_4_ = uStack_2188._4_4_;
    auVar1 = _local_20a0;
    local_1b80 = 0;
    uStack_1b78 = 0;
    uStack_1b70 = 0;
    uStack_1b68 = 0;
    local_1f20 = local_20a0;
    uStack_1f18 = uStack_2098;
    uStack_2090 = auVar87._16_8_;
    uStack_1f10 = uStack_2090;
    uStack_2088 = auVar1._24_8_;
    uStack_1f08 = uStack_2088;
    local_1f40 = 0x42b0c0a542b0c0a5;
    uStack_1f38 = 0x42b0c0a542b0c0a5;
    uStack_1f30 = 0x42b0c0a542b0c0a5;
    uStack_1f28 = 0x42b0c0a542b0c0a5;
    auVar88._16_8_ = uStack_2090;
    auVar88._0_16_ = _local_20a0;
    auVar88._24_8_ = uStack_2088;
    auVar1._8_8_ = 0x42b0c0a542b0c0a5;
    auVar1._0_8_ = 0x42b0c0a542b0c0a5;
    auVar1._16_8_ = 0x42b0c0a542b0c0a5;
    auVar1._24_8_ = 0x42b0c0a542b0c0a5;
    auVar1 = vminps_avx(auVar88,auVar1);
    local_20a0 = auVar1._0_8_;
    local_1f60 = local_20a0;
    uStack_2098 = auVar1._8_8_;
    uStack_1f58 = uStack_2098;
    uStack_2090 = auVar1._16_8_;
    uStack_1f50 = uStack_2090;
    uStack_2088 = auVar1._24_8_;
    uStack_1f48 = uStack_2088;
    local_1f80 = 0xc2b0c0a5c2b0c0a5;
    uStack_1f78 = 0xc2b0c0a5c2b0c0a5;
    uStack_1f70 = 0xc2b0c0a5c2b0c0a5;
    uStack_1f68 = 0xc2b0c0a5c2b0c0a5;
    auVar2._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar2._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar2._16_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar2._24_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar2 = vmaxps_avx(auVar1,auVar2);
    local_1a68 = local_20a0;
    local_19d0 = ::_ps256_cephes_LOG2EF;
    local_19d8 = ::_ps256_0p5;
    local_20a0 = auVar2._0_8_;
    local_1620 = local_20a0;
    uStack_2098 = auVar2._8_8_;
    uStack_1618 = uStack_2098;
    uStack_2090 = auVar2._16_8_;
    uStack_1610 = uStack_2090;
    uStack_2088 = auVar2._24_8_;
    uStack_1608 = uStack_2088;
    local_1640[0] = 1.442695;
    local_1640[1] = 1.442695;
    afStack_1638[0] = 1.442695;
    afStack_1638[1] = 1.442695;
    afStack_1630[0] = 1.442695;
    afStack_1630[1] = 1.442695;
    afStack_1628[0] = 1.442695;
    afStack_1628[1] = 1.442695;
    local_1660[0] = 0.5;
    local_1660[1] = 0.5;
    afStack_1658[0] = 0.5;
    afStack_1658[1] = 0.5;
    afStack_1650[0] = 0.5;
    afStack_1650[1] = 0.5;
    afStack_1648[0] = 0.5;
    afStack_1648[1] = 0.5;
    auVar27._8_4_ = 1.442695;
    auVar27._12_4_ = 1.442695;
    auVar27._0_4_ = 1.442695;
    auVar27._4_4_ = 1.442695;
    auVar27._16_4_ = 1.442695;
    auVar27._20_4_ = 1.442695;
    auVar27._24_4_ = 1.442695;
    auVar27._28_4_ = 1.442695;
    auVar26._8_4_ = 0.5;
    auVar26._12_4_ = 0.5;
    auVar26._0_4_ = 0.5;
    auVar26._4_4_ = 0.5;
    auVar26._16_4_ = 0.5;
    auVar26._20_4_ = 0.5;
    auVar26._24_4_ = 0.5;
    auVar26._28_4_ = 0.5;
    auVar5 = vfmadd213ps_fma(auVar27,auVar2,auVar26);
    auVar88 = vroundps_avx(ZEXT1632(auVar5),1);
    auVar1 = vcmpps_avx(ZEXT1632(auVar5),auVar88,1);
    local_2140._0_8_ = auVar1._0_8_;
    local_18e0 = local_2140._0_8_;
    local_2140._8_8_ = auVar1._8_8_;
    uStack_18d8 = local_2140._8_8_;
    local_2140._16_8_ = auVar1._16_8_;
    uStack_18d0 = local_2140._16_8_;
    local_2140._24_8_ = auVar1._24_8_;
    uStack_18c8 = local_2140._24_8_;
    local_1900 = 0x3f8000003f800000;
    uStack_18f8 = 0x3f8000003f800000;
    uStack_18f0 = 0x3f8000003f800000;
    uStack_18e8 = 0x3f8000003f800000;
    auVar25._8_8_ = 0x3f8000003f800000;
    auVar25._0_8_ = 0x3f8000003f800000;
    auVar25._16_8_ = 0x3f8000003f800000;
    auVar25._24_8_ = 0x3f8000003f800000;
    local_2140 = vandps_avx(auVar1,auVar25);
    local_20c0 = auVar88._0_8_;
    local_2020 = local_20c0;
    uStack_20b8 = auVar88._8_8_;
    uStack_2018 = uStack_20b8;
    uStack_20b0 = auVar88._16_8_;
    uStack_2010 = uStack_20b0;
    uStack_20a8 = auVar88._24_8_;
    uStack_2008 = uStack_20a8;
    local_2040 = local_2140._0_8_;
    uStack_2038 = local_2140._8_8_;
    uStack_2030 = local_2140._16_8_;
    uStack_2028 = local_2140._24_8_;
    local_20e0 = vsubps_avx(auVar88,local_2140);
    local_1880 = local_20e0;
    local_1870 = ::_ps256_cephes_exp_C1;
    local_fc0 = local_20e0._0_8_;
    uStack_fb8 = local_20e0._8_8_;
    uStack_fb0 = local_20e0._16_8_;
    uStack_fa8 = local_20e0._24_8_;
    local_fe0[0] = 0.6933594;
    local_fe0[1] = 0.6933594;
    afStack_fd8[0] = 0.6933594;
    afStack_fd8[1] = 0.6933594;
    afStack_fd0[0] = 0.6933594;
    afStack_fd0[1] = 0.6933594;
    afStack_fc8[0] = 0.6933594;
    afStack_fc8[1] = 0.6933594;
    local_1000 = local_20a0;
    uStack_ff8 = uStack_2098;
    uStack_ff0 = uStack_2090;
    uStack_fe8 = uStack_2088;
    auVar43._8_4_ = 0.6933594;
    auVar43._12_4_ = 0.6933594;
    auVar43._0_4_ = 0.6933594;
    auVar43._4_4_ = 0.6933594;
    auVar43._16_4_ = 0.6933594;
    auVar43._20_4_ = 0.6933594;
    auVar43._24_4_ = 0.6933594;
    auVar43._28_4_ = 0.6933594;
    auVar5 = vfnmadd213ps_fma(auVar43,local_20e0,auVar2);
    local_1888 = ::_ps256_cephes_exp_C2;
    local_f60 = local_20e0._0_8_;
    uStack_f58 = local_20e0._8_8_;
    uStack_f50 = local_20e0._16_8_;
    uStack_f48 = local_20e0._24_8_;
    local_f80[0] = -0.00021219444;
    local_f80[1] = -0.00021219444;
    afStack_f78[0] = -0.00021219444;
    afStack_f78[1] = -0.00021219444;
    afStack_f70[0] = -0.00021219444;
    afStack_f70[1] = -0.00021219444;
    afStack_f68[0] = -0.00021219444;
    afStack_f68[1] = -0.00021219444;
    local_20a0 = auVar5._0_8_;
    local_fa0 = local_20a0;
    uStack_2098 = auVar5._8_8_;
    uStack_f98 = uStack_2098;
    uStack_f90 = 0;
    uStack_f88 = 0;
    auVar44._8_4_ = -0.00021219444;
    auVar44._12_4_ = -0.00021219444;
    auVar44._0_4_ = -0.00021219444;
    auVar44._4_4_ = -0.00021219444;
    auVar44._16_4_ = -0.00021219444;
    auVar44._20_4_ = -0.00021219444;
    auVar44._24_4_ = -0.00021219444;
    auVar44._28_4_ = -0.00021219444;
    auVar5 = vfnmadd213ps_fma(auVar44,local_20e0,ZEXT1632(auVar5));
    auVar88 = ZEXT1632(auVar5);
    local_20a0 = auVar5._0_8_;
    local_1fc0 = local_20a0;
    uStack_2098 = auVar5._8_8_;
    uStack_1fb8 = uStack_2098;
    uStack_1fb0 = 0;
    uStack_1fa8 = 0;
    local_1fa0._0_4_ = auVar5._0_4_;
    local_1fa0._4_4_ = auVar5._4_4_;
    uStack_1f98._0_4_ = auVar5._8_4_;
    uStack_1f98._4_4_ = auVar5._12_4_;
    local_20c0._4_4_ = local_1fa0._4_4_ * local_1fa0._4_4_;
    local_20c0._0_4_ = (float)local_1fa0 * (float)local_1fa0;
    local_1400 = local_20c0;
    uStack_20b8._0_4_ = (float)uStack_1f98 * (float)uStack_1f98;
    uStack_20b8._4_4_ = uStack_1f98._4_4_ * uStack_1f98._4_4_;
    auVar3 = _local_20c0;
    _local_20c0 = ZEXT1632(_local_20c0);
    auVar2 = _local_20c0;
    uStack_2158 = 0x3950696739506967;
    local_2160 = (undefined1  [8])0x3950696739506967;
    uStack_2150 = 0x3950696739506967;
    uStack_2148 = 0x3950696739506967;
    local_1a58 = local_2160;
    local_19f0 = ::_ps256_cephes_exp_p1;
    local_15c0 = 0x3950696739506967;
    uStack_15b8 = 0x3950696739506967;
    uStack_15b0 = 0x3950696739506967;
    uStack_15a8 = 0x3950696739506967;
    local_15e0 = local_20a0;
    uStack_15d8 = uStack_2098;
    uStack_15d0 = 0;
    uStack_15c8 = 0;
    local_1600[0] = 0.0013981999;
    local_1600[1] = 0.0013981999;
    afStack_15f8[0] = 0.0013981999;
    afStack_15f8[1] = 0.0013981999;
    afStack_15f0[0] = 0.0013981999;
    afStack_15f0[1] = 0.0013981999;
    afStack_15e8[0] = 0.0013981999;
    afStack_15e8[1] = 0.0013981999;
    auVar28._8_4_ = 0.0013981999;
    auVar28._12_4_ = 0.0013981999;
    auVar28._0_4_ = 0.0013981999;
    auVar28._4_4_ = 0.0013981999;
    auVar28._16_4_ = 0.0013981999;
    auVar28._20_4_ = 0.0013981999;
    auVar28._24_4_ = 0.0013981999;
    auVar28._28_4_ = 0.0013981999;
    auVar5 = vfmadd213ps_fma(auVar88,_local_2160,auVar28);
    local_1a08 = ::_ps256_cephes_exp_p2;
    local_2160 = auVar5._0_8_;
    local_1560 = local_2160;
    uStack_2158 = auVar5._8_8_;
    uStack_1558 = uStack_2158;
    uStack_1550 = 0;
    uStack_1548 = 0;
    local_1580 = local_20a0;
    uStack_1578 = uStack_2098;
    uStack_1570 = 0;
    uStack_1568 = 0;
    local_15a0[0] = 0.008333452;
    local_15a0[1] = 0.008333452;
    afStack_1598[0] = 0.008333452;
    afStack_1598[1] = 0.008333452;
    afStack_1590[0] = 0.008333452;
    afStack_1590[1] = 0.008333452;
    afStack_1588[0] = 0.008333452;
    afStack_1588[1] = 0.008333452;
    auVar29._8_4_ = 0.008333452;
    auVar29._12_4_ = 0.008333452;
    auVar29._0_4_ = 0.008333452;
    auVar29._4_4_ = 0.008333452;
    auVar29._16_4_ = 0.008333452;
    auVar29._20_4_ = 0.008333452;
    auVar29._24_4_ = 0.008333452;
    auVar29._28_4_ = 0.008333452;
    auVar5 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar5),auVar29);
    local_1a20 = ::_ps256_cephes_exp_p3;
    local_2160 = auVar5._0_8_;
    local_1500 = local_2160;
    uStack_2158 = auVar5._8_8_;
    uStack_14f8 = uStack_2158;
    uStack_14f0 = 0;
    uStack_14e8 = 0;
    local_1520 = local_20a0;
    uStack_1518 = uStack_2098;
    uStack_1510 = 0;
    uStack_1508 = 0;
    local_1540[0] = 0.041665796;
    local_1540[1] = 0.041665796;
    afStack_1538[0] = 0.041665796;
    afStack_1538[1] = 0.041665796;
    afStack_1530[0] = 0.041665796;
    afStack_1530[1] = 0.041665796;
    afStack_1528[0] = 0.041665796;
    afStack_1528[1] = 0.041665796;
    auVar30._8_4_ = 0.041665796;
    auVar30._12_4_ = 0.041665796;
    auVar30._0_4_ = 0.041665796;
    auVar30._4_4_ = 0.041665796;
    auVar30._16_4_ = 0.041665796;
    auVar30._20_4_ = 0.041665796;
    auVar30._24_4_ = 0.041665796;
    auVar30._28_4_ = 0.041665796;
    auVar5 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar5),auVar30);
    local_1a38 = ::_ps256_cephes_exp_p4;
    local_2160 = auVar5._0_8_;
    local_14a0 = local_2160;
    uStack_2158 = auVar5._8_8_;
    uStack_1498 = uStack_2158;
    uStack_1490 = 0;
    uStack_1488 = 0;
    local_14c0 = local_20a0;
    uStack_14b8 = uStack_2098;
    uStack_14b0 = 0;
    uStack_14a8 = 0;
    local_14e0[0] = 0.16666666;
    local_14e0[1] = 0.16666666;
    afStack_14d8[0] = 0.16666666;
    afStack_14d8[1] = 0.16666666;
    afStack_14d0[0] = 0.16666666;
    afStack_14d0[1] = 0.16666666;
    afStack_14c8[0] = 0.16666666;
    afStack_14c8[1] = 0.16666666;
    auVar31._8_4_ = 0.16666666;
    auVar31._12_4_ = 0.16666666;
    auVar31._0_4_ = 0.16666666;
    auVar31._4_4_ = 0.16666666;
    auVar31._16_4_ = 0.16666666;
    auVar31._20_4_ = 0.16666666;
    auVar31._24_4_ = 0.16666666;
    auVar31._28_4_ = 0.16666666;
    auVar5 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar5),auVar31);
    local_1a50 = ::_ps256_cephes_exp_p5;
    local_2160 = auVar5._0_8_;
    local_1440 = local_2160;
    uStack_2158 = auVar5._8_8_;
    uStack_1438 = uStack_2158;
    uStack_1430 = 0;
    uStack_1428 = 0;
    local_1460 = local_20a0;
    uStack_1458 = uStack_2098;
    uStack_1450 = 0;
    uStack_1448 = 0;
    local_1480[0] = 0.5;
    local_1480[1] = 0.5;
    afStack_1478[0] = 0.5;
    afStack_1478[1] = 0.5;
    afStack_1470[0] = 0.5;
    afStack_1470[1] = 0.5;
    afStack_1468[0] = 0.5;
    afStack_1468[1] = 0.5;
    auVar32._8_4_ = 0.5;
    auVar32._12_4_ = 0.5;
    auVar32._0_4_ = 0.5;
    auVar32._4_4_ = 0.5;
    auVar32._16_4_ = 0.5;
    auVar32._20_4_ = 0.5;
    auVar32._24_4_ = 0.5;
    auVar32._28_4_ = 0.5;
    auVar5 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar5),auVar32);
    local_1a60 = local_20c0;
    local_2160 = auVar5._0_8_;
    local_13e0 = local_2160;
    uStack_2158 = auVar5._8_8_;
    uStack_13d8 = uStack_2158;
    uStack_13d0 = 0;
    uStack_13c8 = 0;
    uStack_20b8 = auVar3._8_8_;
    uStack_13f8 = uStack_20b8;
    uStack_13f0 = 0;
    uStack_13e8 = 0;
    local_1420 = local_20a0;
    uStack_1418 = uStack_2098;
    uStack_1410 = 0;
    uStack_1408 = 0;
    auVar5 = vfmadd213ps_fma(auVar2,ZEXT1632(auVar5),auVar88);
    local_2160 = auVar5._0_8_;
    uVar18 = local_2160;
    uStack_2158 = auVar5._8_8_;
    uVar19 = uStack_2158;
    uStack_2050 = 0;
    uStack_2048 = 0;
    local_2080 = 0x3f8000003f800000;
    uStack_2078 = 0x3f8000003f800000;
    uStack_2070 = 0x3f8000003f800000;
    uStack_2068 = 0x3f8000003f800000;
    local_2060._0_4_ = auVar5._0_4_;
    local_2060._4_4_ = auVar5._4_4_;
    uStack_2058._0_4_ = auVar5._8_4_;
    uStack_2058._4_4_ = auVar5._12_4_;
    local_2160._4_4_ = local_2060._4_4_ + 1.0;
    local_2160._0_4_ = (float)local_2060 + 1.0;
    uStack_2158._0_4_ = (float)uStack_2058 + 1.0;
    uStack_2158._4_4_ = uStack_2058._4_4_ + 1.0;
    uStack_2150._0_4_ = 0x3f800000;
    uStack_2150._4_4_ = 0x3f800000;
    auVar87 = _local_2160;
    uStack_2148._0_4_ = 0x3f800000;
    uStack_2148._4_4_ = 0x3f800000;
    auVar1 = _local_2160;
    local_1860._0_4_ = local_20e0._0_4_;
    local_1860._4_4_ = local_20e0._4_4_;
    uStack_1858._0_4_ = local_20e0._8_4_;
    uStack_1858._4_4_ = local_20e0._12_4_;
    uStack_1850._0_4_ = local_20e0._16_4_;
    uStack_1850._4_4_ = local_20e0._20_4_;
    uStack_1848._0_4_ = local_20e0._24_4_;
    uStack_1848._4_4_ = local_20e0._28_4_;
    local_2100 = CONCAT44((int)local_1860._4_4_,(int)(float)local_1860);
    uStack_20f8 = CONCAT44((int)uStack_1858._4_4_,(int)(float)uStack_1858);
    uStack_20f0 = CONCAT44((int)uStack_1850._4_4_,(int)(float)uStack_1850);
    uStack_20e8 = CONCAT44((int)uStack_1848._4_4_,(int)(float)uStack_1848);
    local_1760 = local_2100;
    uStack_1758 = uStack_20f8;
    uStack_1750 = uStack_20f0;
    uStack_1748 = uStack_20e8;
    local_1800 = local_2100;
    uStack_17f8 = uStack_20f8;
    uStack_17f0 = uStack_20f0;
    uStack_17e8 = uStack_20e8;
    local_1820 = 0x7f0000007f;
    uStack_1818 = 0x7f0000007f;
    uStack_1810 = 0x7f0000007f;
    uStack_1808 = 0x7f0000007f;
    local_17b0 = 0x7f0000007f;
    uStack_17a8 = 0x7f0000007f;
    local_17c0 = 0x7f0000007f;
    uStack_17b8 = 0x7f0000007f;
    local_eb0 = local_2100;
    uStack_ea8 = uStack_20f8;
    local_ec0 = 0x7f0000007f;
    uStack_eb8 = 0x7f0000007f;
    auVar47._8_8_ = uStack_20f8;
    auVar47._0_8_ = local_2100;
    auVar46._8_8_ = 0x7f0000007f;
    auVar46._0_8_ = 0x7f0000007f;
    local_1790 = vpaddd_avx(auVar47,auVar46);
    local_ed0 = uStack_20f0;
    uStack_ec8 = uStack_20e8;
    local_ee0 = 0x7f0000007f;
    uStack_ed8 = 0x7f0000007f;
    auVar3._8_8_ = uStack_20e8;
    auVar3._0_8_ = uStack_20f0;
    auVar5._8_8_ = 0x7f0000007f;
    auVar5._0_8_ = 0x7f0000007f;
    local_17a0 = vpaddd_avx(auVar3,auVar5);
    local_1840 = local_1790._0_8_;
    uStack_1838 = local_1790._8_8_;
    uStack_1830 = local_17a0._0_8_;
    uStack_1828 = local_17a0._8_8_;
    local_17e0 = local_1790._0_8_;
    uStack_17d8 = local_1790._8_8_;
    uStack_17d0 = local_17a0._0_8_;
    uStack_17c8 = local_17a0._8_8_;
    local_16a0 = local_1790._0_8_;
    uStack_1698 = local_1790._8_8_;
    uStack_1690 = local_17a0._0_8_;
    uStack_1688 = local_17a0._8_8_;
    local_16a4 = 0x17;
    local_1720 = local_1790._0_8_;
    uStack_1718 = local_1790._8_8_;
    uStack_1710 = local_17a0._0_8_;
    uStack_1708 = local_17a0._8_8_;
    local_e70 = local_1790._0_8_;
    uStack_e68 = local_1790._8_8_;
    local_e74 = 0x17;
    local_16c0 = vpslld_avx(local_1790,ZEXT416(0x17));
    local_e90 = local_17a0._0_8_;
    uStack_e88 = local_17a0._8_8_;
    local_e94 = 0x17;
    local_16d0 = vpslld_avx(local_17a0,ZEXT416(0x17));
    local_1740 = local_16c0._0_8_;
    uStack_1738 = local_16c0._8_8_;
    uStack_1730 = local_16d0._0_8_;
    uStack_1728 = local_16d0._8_8_;
    local_1700 = local_16c0._0_8_;
    uStack_16f8 = local_16c0._8_8_;
    uStack_16f0 = local_16d0._0_8_;
    uStack_16e8 = local_16d0._8_8_;
    local_2100 = local_16c0._0_8_;
    uStack_20f8 = local_16c0._8_8_;
    uStack_20f0 = local_16d0._0_8_;
    uStack_20e8 = local_16d0._8_8_;
    local_1680 = local_16c0._0_8_;
    uStack_1678 = local_16c0._8_8_;
    uStack_1670 = local_16d0._0_8_;
    uStack_1668 = local_16d0._8_8_;
    local_2180 = local_16c0._0_8_;
    uStack_2178 = local_16c0._8_8_;
    uStack_2170 = local_16d0._0_8_;
    uStack_2168 = local_16d0._8_8_;
    local_1fe0 = local_2160;
    uStack_1fd8 = uStack_2158;
    uStack_2150 = auVar87._16_8_;
    uStack_1fd0 = uStack_2150;
    uStack_2148 = auVar1._24_8_;
    uStack_1fc8 = uStack_2148;
    local_2000._0_4_ = local_16c0._0_4_;
    local_2000._4_4_ = local_16c0._4_4_;
    uStack_1ff8._0_4_ = local_16c0._8_4_;
    uStack_1ff8._4_4_ = local_16c0._12_4_;
    uStack_1ff0._0_4_ = local_16d0._0_4_;
    uStack_1ff0._4_4_ = local_16d0._4_4_;
    uStack_1fe8._0_4_ = local_16d0._8_4_;
    local_2160._4_4_ = (local_2060._4_4_ + 1.0) * local_2000._4_4_;
    local_2160._0_4_ = ((float)local_2060 + 1.0) * (float)local_2000;
    uStack_2158._0_4_ = ((float)uStack_2058 + 1.0) * (float)uStack_1ff8;
    uStack_2158._4_4_ = (uStack_2058._4_4_ + 1.0) * uStack_1ff8._4_4_;
    uStack_2150._0_4_ = (float)uStack_1ff0 * 1.0;
    uStack_2150._4_4_ = uStack_1ff0._4_4_ * 1.0;
    auVar87 = _local_2160;
    uStack_2148._0_4_ = (float)uStack_1fe8 * 1.0;
    uStack_2148._4_4_ = 0x3f800000;
    auVar1 = _local_2160;
    local_2380 = local_2160;
    uStack_2378 = uStack_2158;
    uStack_2150 = auVar87._16_8_;
    uStack_2370 = uStack_2150;
    uStack_2148 = auVar1._24_8_;
    uStack_2368 = uStack_2148;
    local_2288 = local_22e8;
    local_22c0 = local_2160;
    uStack_22b8 = uStack_2158;
    uStack_22b0 = uStack_2150;
    uStack_22a8 = uStack_2148;
    *(undefined1 (*) [8])local_22e8 = local_2160;
    *(undefined8 *)(local_22e8 + 2) = uStack_2158;
    *(undefined8 *)(local_22e8 + 4) = uStack_2150;
    *(undefined8 *)(local_22e8 + 6) = uStack_2148;
    local_22e0 = local_22e0 + 1;
    local_22e8 = local_22e8 + 8;
    local_21e0 = local_2360;
    uStack_21d8 = uStack_2358;
    uStack_21d0 = uStack_2350;
    uStack_21c8 = uStack_2348;
    local_21c0 = local_1f00;
    uStack_21b8 = uStack_1ef8;
    uStack_21b0 = uStack_1ef0;
    uStack_21a8 = uStack_1ee8;
    local_21a0 = local_2200;
    uStack_2198 = uStack_21f8;
    uStack_2190 = uStack_21f0;
    uStack_2188 = uStack_21e8;
    _local_2160 = auVar1;
    _local_20c0 = auVar2;
    _local_20a0 = auVar88;
    local_2060 = uVar18;
    uStack_2058 = uVar19;
    local_2000 = local_16c0._0_8_;
    uStack_1ff8 = local_16c0._8_8_;
    uStack_1ff0 = local_16d0._0_8_;
    uStack_1fe8 = local_16d0._8_8_;
    local_1fa0 = local_1fc0;
    uStack_1f98 = uStack_1fb8;
    uStack_1f90 = uStack_1fb0;
    uStack_1f88 = uStack_1fa8;
    local_1e40 = local_2120;
    uStack_1e38 = uStack_2118;
    uStack_1e30 = uStack_2110;
    uStack_1e28 = uStack_2108;
    _local_1e00 = ZEXT1632(auVar4);
    local_1de0 = uVar16;
    uStack_1dd8 = uVar17;
    local_1da0 = local_1ec0._0_8_;
    uStack_1d98 = local_1ec0._8_8_;
    uStack_1d90 = local_1ec0._16_8_;
    uStack_1d88 = local_1ec0._24_8_;
    local_1d80 = uVar10;
    uStack_1d78 = uVar11;
    uStack_1d70 = uVar12;
    uStack_1d68 = uVar13;
    local_1d40 = uVar6;
    uStack_1d38 = uVar7;
    uStack_1d30 = uVar8;
    uStack_1d28 = uVar9;
    local_1c40 = uVar14;
    uStack_1c38 = uVar15;
    local_1c00 = local_1c20;
    uStack_1bf8 = uStack_1c18;
    uStack_1bf0 = uStack_1c10;
    uStack_1be8 = uStack_1c08;
    uStack_1bb0 = uStack_2350;
    uStack_1ba8 = uStack_2348;
    local_1b30 = local_1b48;
    local_1b20 = local_1b58;
    local_1b18 = local_1b40;
    local_1b08 = local_1b58;
    local_1b00 = local_1b40;
    local_1af0 = local_1b58;
    local_1ae8 = local_1b40;
    local_1ad8 = local_1b58;
    local_1ad0 = local_1b40;
    local_1ac0 = local_1b58;
    local_1ab8 = local_1b40;
    local_1aa8 = local_1b58;
    local_1aa0 = local_1b40;
    local_1a90 = local_1b58;
    local_1a88 = local_1b40;
    local_1a78 = local_1b58;
    local_1a70 = local_1b40;
    local_1a48 = local_1a68;
    local_1a40 = local_1a58;
    local_1a30 = local_1a68;
    local_1a28 = local_1a58;
    local_1a18 = local_1a68;
    local_1a10 = local_1a58;
    local_1a00 = local_1a68;
    local_19f8 = local_1a58;
    local_19e8 = local_1a68;
    local_19e0 = local_1a58;
    local_19c8 = local_1a68;
    local_18a8 = local_1b40;
    local_1890 = local_1a68;
    local_1878 = local_1a68;
    local_1868 = local_1880;
    local_1860 = local_20e0._0_8_;
    uStack_1858 = local_20e0._8_8_;
    uStack_1850 = local_20e0._16_8_;
    uStack_1848 = local_20e0._24_8_;
    local_c40 = local_1780;
    uStack_c38 = uStack_1778;
    uStack_c30 = uStack_1770;
    uStack_c28 = uStack_1768;
  }
  for (; local_22ec = in_ECX, local_22fc + 3 < in_ECX; local_22fc = local_22fc + 4) {
    local_2280 = local_22e0;
    local_2390 = *(undefined8 *)*local_22e0;
    uStack_2388 = *(undefined8 *)(*local_22e0 + 8);
    local_b48 = local_22f1;
    local_b50 = &local_2310;
    local_b58 = &local_2390;
    local_b40 = local_23b0;
    uStack_b38 = uStack_23a8;
    local_ad0 = 0x3f8000003f800000;
    uStack_ac8 = 0x3f8000003f800000;
    local_750 = 0;
    uStack_748 = 0;
    local_e0 = 0;
    uStack_d8 = 0;
    local_8f0 = vcmpps_avx(*(undefined1 (*) [16])*local_22e0,ZEXT816(0),2);
    local_7b0 = 0x80000000800000;
    uStack_7a8 = 0x80000000800000;
    auVar58._8_8_ = 0x80000000800000;
    auVar58._0_8_ = 0x80000000800000;
    auVar4 = vmaxps_avx(*(undefined1 (*) [16])*local_22e0,auVar58);
    local_8c0 = auVar4._0_8_;
    local_c0 = local_8c0;
    uStack_8b8 = auVar4._8_8_;
    uStack_b8 = uStack_8b8;
    local_780 = local_8c0;
    uStack_778 = uStack_8b8;
    local_784 = 0x17;
    auVar3 = vpsrld_avx(auVar4,ZEXT416(0x17));
    local_680 = local_8c0;
    uStack_678 = uStack_8b8;
    local_690 = 0x807fffff807fffff;
    uStack_688 = 0x807fffff807fffff;
    auVar63._8_8_ = 0x807fffff807fffff;
    auVar63._0_8_ = 0x807fffff807fffff;
    auVar4 = vpand_avx(auVar4,auVar63);
    local_8c0 = auVar4._0_8_;
    local_80 = local_8c0;
    uStack_8b8 = auVar4._8_8_;
    uStack_78 = uStack_8b8;
    local_a60 = 0x3f0000003f000000;
    uStack_a58 = 0x3f0000003f000000;
    auVar83._8_8_ = 0x3f0000003f000000;
    auVar83._0_8_ = 0x3f0000003f000000;
    auVar5 = vpor_avx(auVar4,auVar83);
    local_8d0._0_8_ = auVar3._0_8_;
    local_760 = local_8d0._0_8_;
    local_8d0._8_8_ = auVar3._8_8_;
    uStack_758 = local_8d0._8_8_;
    local_980 = 0x7f0000007f;
    uStack_978 = 0x7f0000007f;
    auVar59._8_8_ = 0x7f0000007f;
    auVar59._0_8_ = 0x7f0000007f;
    local_8d0 = vpsubd_avx(auVar3,auVar59);
    local_710 = local_8d0._0_8_;
    uStack_708 = local_8d0._8_8_;
    auVar4 = vcvtdq2ps_avx(local_8d0);
    local_900 = auVar4._0_8_;
    uVar6 = local_900;
    uStack_8f8 = auVar4._8_8_;
    uVar7 = uStack_8f8;
    local_870 = 0x3f8000003f800000;
    uStack_868 = 0x3f8000003f800000;
    local_860._0_4_ = auVar4._0_4_;
    local_860._4_4_ = auVar4._4_4_;
    uStack_858._0_4_ = auVar4._8_4_;
    uStack_858._4_4_ = auVar4._12_4_;
    local_900._4_4_ = local_860._4_4_ + 1.0;
    local_900._0_4_ = (float)local_860 + 1.0;
    uStack_8f8._0_4_ = (float)uStack_858 + 1.0;
    uStack_8f8._4_4_ = uStack_858._4_4_ + 1.0;
    local_8c0 = auVar5._0_8_;
    local_60 = local_8c0;
    uStack_8b8 = auVar5._8_8_;
    uStack_58 = uStack_8b8;
    local_70 = 0x3f3504f33f3504f3;
    uStack_68 = 0x3f3504f33f3504f3;
    auVar84._8_8_ = 0x3f3504f33f3504f3;
    auVar84._0_8_ = 0x3f3504f33f3504f3;
    local_910 = vcmpps_avx(auVar5,auVar84,1);
    local_6a0 = local_8c0;
    uStack_698 = uStack_8b8;
    local_6b0 = local_910._0_8_;
    uStack_6a8 = local_910._8_8_;
    local_920 = vpand_avx(auVar5,local_910);
    local_820 = local_8c0;
    uStack_818 = uStack_8b8;
    local_830 = 0x3f8000003f800000;
    uStack_828 = 0x3f8000003f800000;
    auVar57._8_8_ = 0x3f8000003f800000;
    auVar57._0_8_ = 0x3f8000003f800000;
    auVar4 = vsubps_avx(auVar5,auVar57);
    local_840 = local_900;
    uStack_838 = uStack_8f8;
    local_6c0 = 0x3f8000003f800000;
    uStack_6b8 = 0x3f8000003f800000;
    local_6d0 = local_910._0_8_;
    uStack_6c8 = local_910._8_8_;
    auVar62._8_8_ = 0x3f8000003f800000;
    auVar62._0_8_ = 0x3f8000003f800000;
    local_850 = vpand_avx(auVar62,local_910);
    auVar56._8_8_ = uStack_8f8;
    auVar56._0_8_ = local_900;
    _local_900 = vsubps_avx(auVar56,local_850);
    local_8c0 = auVar4._0_8_;
    uVar8 = local_8c0;
    uStack_8b8 = auVar4._8_8_;
    uVar9 = uStack_8b8;
    local_880._0_4_ = auVar4._0_4_;
    local_880._4_4_ = auVar4._4_4_;
    uStack_878._0_4_ = auVar4._8_4_;
    uStack_878._4_4_ = auVar4._12_4_;
    local_890._0_4_ = local_920._0_4_;
    local_890._4_4_ = local_920._4_4_;
    uStack_888._0_4_ = local_920._8_4_;
    uStack_888._4_4_ = local_920._12_4_;
    local_8c0._0_4_ = (float)local_880 + (float)local_890;
    local_8c0._4_4_ = local_880._4_4_ + local_890._4_4_;
    uStack_878._0_4_ = (float)uStack_878 + (float)uStack_888;
    uStack_878._4_4_ = uStack_878._4_4_ + uStack_888._4_4_;
    uStack_8b8._0_4_ = (float)uStack_878;
    uStack_8b8._4_4_ = uStack_878._4_4_;
    local_7d0 = local_8c0;
    uStack_7c8 = uStack_8b8;
    local_930 = (float)local_8c0._0_4_ * (float)local_8c0._0_4_;
    fStack_92c = (float)local_8c0._4_4_ * (float)local_8c0._4_4_;
    fStack_928 = (float)uStack_878 * (float)uStack_878;
    fStack_924 = uStack_878._4_4_ * uStack_878._4_4_;
    uStack_938 = 0x3d9021bb3d9021bb;
    local_940 = (undefined1  [8])0x3d9021bb3d9021bb;
    local_648 = local_940;
    local_600 = local_8c0;
    local_528 = ::_ps_cephes_log_p1;
    local_2a0 = 0x3d9021bb3d9021bb;
    uStack_298 = 0x3d9021bb3d9021bb;
    local_2b0 = local_8c0;
    uStack_2a8 = uStack_8b8;
    local_2c0[0] = -0.1151461;
    local_2c0[1] = -0.1151461;
    afStack_2b8[0] = -0.1151461;
    afStack_2b8[1] = -0.1151461;
    auVar73._8_4_ = -0.1151461;
    auVar73._12_4_ = -0.1151461;
    auVar73._0_4_ = -0.1151461;
    auVar73._4_4_ = -0.1151461;
    auVar4 = vfmadd213ps_fma(_local_8c0,_local_940,auVar73);
    local_540 = ::_ps_cephes_log_p2;
    local_940 = auVar4._0_8_;
    local_270 = local_940;
    uStack_938 = auVar4._8_8_;
    uStack_268 = uStack_938;
    local_280 = local_8c0;
    uStack_278 = uStack_8b8;
    local_290[0] = 0.116769984;
    local_290[1] = 0.116769984;
    afStack_288[0] = 0.116769984;
    afStack_288[1] = 0.116769984;
    auVar74._8_4_ = 0.116769984;
    auVar74._12_4_ = 0.116769984;
    auVar74._0_4_ = 0.116769984;
    auVar74._4_4_ = 0.116769984;
    auVar4 = vfmadd213ps_fma(_local_8c0,auVar4,auVar74);
    local_558 = ::_ps_cephes_log_p3;
    local_940 = auVar4._0_8_;
    local_240 = local_940;
    uStack_938 = auVar4._8_8_;
    uStack_238 = uStack_938;
    local_250 = local_8c0;
    uStack_248 = uStack_8b8;
    local_260[0] = -0.12420141;
    local_260[1] = -0.12420141;
    afStack_258[0] = -0.12420141;
    afStack_258[1] = -0.12420141;
    auVar75._8_4_ = -0.12420141;
    auVar75._12_4_ = -0.12420141;
    auVar75._0_4_ = -0.12420141;
    auVar75._4_4_ = -0.12420141;
    auVar4 = vfmadd213ps_fma(_local_8c0,auVar4,auVar75);
    local_570 = ::_ps_cephes_log_p4;
    local_940 = auVar4._0_8_;
    local_210 = local_940;
    uStack_938 = auVar4._8_8_;
    uStack_208 = uStack_938;
    local_220 = local_8c0;
    uStack_218 = uStack_8b8;
    local_230[0] = 0.14249323;
    local_230[1] = 0.14249323;
    afStack_228[0] = 0.14249323;
    afStack_228[1] = 0.14249323;
    auVar76._8_4_ = 0.14249323;
    auVar76._12_4_ = 0.14249323;
    auVar76._0_4_ = 0.14249323;
    auVar76._4_4_ = 0.14249323;
    auVar4 = vfmadd213ps_fma(_local_8c0,auVar4,auVar76);
    local_588 = ::_ps_cephes_log_p5;
    local_940 = auVar4._0_8_;
    local_1e0 = local_940;
    uStack_938 = auVar4._8_8_;
    uStack_1d8 = uStack_938;
    local_1f0 = local_8c0;
    uStack_1e8 = uStack_8b8;
    local_200[0] = -0.16668057;
    local_200[1] = -0.16668057;
    afStack_1f8[0] = -0.16668057;
    afStack_1f8[1] = -0.16668057;
    auVar77._8_4_ = -0.16668057;
    auVar77._12_4_ = -0.16668057;
    auVar77._0_4_ = -0.16668057;
    auVar77._4_4_ = -0.16668057;
    auVar4 = vfmadd213ps_fma(_local_8c0,auVar4,auVar77);
    local_5a0 = ::_ps_cephes_log_p6;
    local_940 = auVar4._0_8_;
    local_1b0 = local_940;
    uStack_938 = auVar4._8_8_;
    uStack_1a8 = uStack_938;
    local_1c0 = local_8c0;
    uStack_1b8 = uStack_8b8;
    local_1d0[0] = 0.20000714;
    local_1d0[1] = 0.20000714;
    afStack_1c8[0] = 0.20000714;
    afStack_1c8[1] = 0.20000714;
    auVar78._8_4_ = 0.20000714;
    auVar78._12_4_ = 0.20000714;
    auVar78._0_4_ = 0.20000714;
    auVar78._4_4_ = 0.20000714;
    auVar4 = vfmadd213ps_fma(_local_8c0,auVar4,auVar78);
    local_5b8 = ::_ps_cephes_log_p7;
    local_940 = auVar4._0_8_;
    local_180 = local_940;
    uStack_938 = auVar4._8_8_;
    uStack_178 = uStack_938;
    local_190 = local_8c0;
    uStack_188 = uStack_8b8;
    local_1a0[0] = -0.24999994;
    local_1a0[1] = -0.24999994;
    afStack_198[0] = -0.24999994;
    afStack_198[1] = -0.24999994;
    auVar79._8_4_ = -0.24999994;
    auVar79._12_4_ = -0.24999994;
    auVar79._0_4_ = -0.24999994;
    auVar79._4_4_ = -0.24999994;
    auVar4 = vfmadd213ps_fma(_local_8c0,auVar4,auVar79);
    local_5d0 = ::_ps_cephes_log_p8;
    local_940 = auVar4._0_8_;
    local_150 = local_940;
    uStack_938 = auVar4._8_8_;
    uStack_148 = uStack_938;
    local_160 = local_8c0;
    uStack_158 = uStack_8b8;
    local_170[0] = 0.3333333;
    local_170[1] = 0.3333333;
    afStack_168[0] = 0.3333333;
    afStack_168[1] = 0.3333333;
    auVar80._8_4_ = 0.3333333;
    auVar80._12_4_ = 0.3333333;
    auVar80._0_4_ = 0.3333333;
    auVar80._4_4_ = 0.3333333;
    auVar4 = vfmadd213ps_fma(_local_8c0,auVar4,auVar80);
    local_940 = auVar4._0_8_;
    uVar10 = local_940;
    uStack_938 = auVar4._8_8_;
    uVar11 = uStack_938;
    local_7f0 = local_8c0;
    uStack_7e8 = uStack_8b8;
    local_7e0._0_4_ = auVar4._0_4_;
    local_7e0._4_4_ = auVar4._4_4_;
    uStack_7d8._0_4_ = auVar4._8_4_;
    uStack_7d8._4_4_ = auVar4._12_4_;
    local_940._4_4_ = local_7e0._4_4_ * (float)local_8c0._4_4_;
    local_940._0_4_ = (float)local_7e0 * (float)local_8c0._0_4_;
    uStack_938._0_4_ = (float)uStack_7d8 * (float)uStack_878;
    uStack_938._4_4_ = uStack_7d8._4_4_ * uStack_878._4_4_;
    local_800 = local_940;
    uStack_7f8 = uStack_938;
    local_810 = CONCAT44(fStack_92c,local_930);
    uStack_808 = CONCAT44(fStack_924,fStack_928);
    local_940._4_4_ = local_7e0._4_4_ * (float)local_8c0._4_4_ * fStack_92c;
    local_940._0_4_ = (float)local_7e0 * (float)local_8c0._0_4_ * local_930;
    uStack_938._0_4_ = (float)uStack_7d8 * (float)uStack_878 * fStack_928;
    uStack_938._4_4_ = uStack_7d8._4_4_ * uStack_878._4_4_ * fStack_924;
    local_5f0 = local_900;
    local_5e0 = ::_ps_cephes_log_q1;
    local_120 = local_900;
    uStack_118 = uStack_8f8;
    local_130[0] = -0.00021219444;
    local_130[1] = -0.00021219444;
    afStack_128[0] = -0.00021219444;
    afStack_128[1] = -0.00021219444;
    local_140 = local_940;
    uStack_138 = uStack_938;
    auVar81._8_4_ = -0.00021219444;
    auVar81._12_4_ = -0.00021219444;
    auVar81._0_4_ = -0.00021219444;
    auVar81._4_4_ = -0.00021219444;
    auVar4 = vfmadd213ps_fma(auVar81,_local_900,_local_940);
    local_638 = &local_930;
    local_640 = ::_ps_0p5;
    local_3f0 = CONCAT44(fStack_92c,local_930);
    uStack_3e8 = CONCAT44(fStack_924,fStack_928);
    auVar86._4_4_ = fStack_92c;
    auVar86._0_4_ = local_930;
    auVar86._8_4_ = fStack_928;
    auVar86._12_4_ = fStack_924;
    local_400[0] = 0.5;
    local_400[1] = 0.5;
    afStack_3f8[0] = 0.5;
    afStack_3f8[1] = 0.5;
    local_940 = auVar4._0_8_;
    local_410 = local_940;
    uStack_938 = auVar4._8_8_;
    uStack_408 = uStack_938;
    auVar67._8_4_ = 0.5;
    auVar67._12_4_ = 0.5;
    auVar67._0_4_ = 0.5;
    auVar67._4_4_ = 0.5;
    _local_940 = vfnmadd213ps_fma(auVar67,auVar86,auVar4);
    local_8a0 = local_8c0;
    uStack_898 = uStack_8b8;
    local_8b0._0_4_ = local_940._0_4_;
    local_8b0._4_4_ = local_940._4_4_;
    uStack_8a8._0_4_ = local_940._8_4_;
    uStack_8a8._4_4_ = local_940._12_4_;
    local_8c0._4_4_ = (float)local_8c0._4_4_ + local_8b0._4_4_;
    local_8c0._0_4_ = (float)local_8c0._0_4_ + (float)local_8b0;
    uStack_8b8._0_4_ = (float)uStack_878 + (float)uStack_8a8;
    uStack_8b8._4_4_ = uStack_878._4_4_ + uStack_8a8._4_4_;
    local_5f8 = ::_ps_cephes_log_q2;
    local_f0 = local_900;
    uStack_e8 = uStack_8f8;
    local_100[0] = 0.6933594;
    local_100[1] = 0.6933594;
    afStack_f8[0] = 0.6933594;
    afStack_f8[1] = 0.6933594;
    local_110 = local_8c0;
    uStack_108 = uStack_8b8;
    auVar82._8_4_ = 0.6933594;
    auVar82._12_4_ = 0.6933594;
    auVar82._0_4_ = 0.6933594;
    auVar82._4_4_ = 0.6933594;
    auVar4 = vfmadd213ps_fma(auVar82,_local_900,_local_8c0);
    local_8c0 = auVar4._0_8_;
    local_a0 = local_8c0;
    uStack_8b8 = auVar4._8_8_;
    uStack_98 = uStack_8b8;
    local_b0 = local_8f0._0_8_;
    uStack_a8 = local_8f0._8_8_;
    _local_8c0 = vpor_avx(auVar4,local_8f0);
    local_b10._0_4_ = (float)local_23b0;
    local_b10._4_4_ = (float)((ulong)local_23b0 >> 0x20);
    uStack_b08._0_4_ = (float)uStack_23a8;
    uStack_b08._4_4_ = (float)((ulong)uStack_23a8 >> 0x20);
    local_b20._0_4_ = local_8c0._0_4_;
    local_b20._4_4_ = local_8c0._4_4_;
    uStack_b18._0_4_ = local_8c0._8_4_;
    uStack_b18._4_4_ = local_8c0._12_4_;
    local_a90._4_4_ = local_b10._4_4_ * local_b20._4_4_;
    local_a90._0_4_ = (float)local_b10 * (float)local_b20;
    uStack_a88._0_4_ = (float)uStack_b08 * (float)uStack_b18;
    uStack_a88._4_4_ = uStack_b08._4_4_ * uStack_b18._4_4_;
    local_740 = 0;
    uStack_738 = 0;
    local_990 = local_a90;
    uStack_988 = uStack_a88;
    local_9a0 = 0x42b0c0a542b0c0a5;
    uStack_998 = 0x42b0c0a542b0c0a5;
    auVar53._8_8_ = uStack_a88;
    auVar53._0_8_ = local_a90;
    auVar52._8_8_ = 0x42b0c0a542b0c0a5;
    auVar52._0_8_ = 0x42b0c0a542b0c0a5;
    auVar4 = vminps_avx(auVar53,auVar52);
    local_a90 = auVar4._0_8_;
    local_9b0 = local_a90;
    uStack_a88 = auVar4._8_8_;
    uStack_9a8 = uStack_a88;
    local_9c0 = 0xc2b0c0a5c2b0c0a5;
    uStack_9b8 = 0xc2b0c0a5c2b0c0a5;
    auVar51._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar51._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3 = vmaxps_avx(auVar4,auVar51);
    local_a90 = auVar3._0_8_;
    uVar12 = local_a90;
    uStack_a88 = auVar3._8_8_;
    uVar13 = uStack_a88;
    local_9e0 = 0x3fb8aa3b3fb8aa3b;
    uStack_9d8 = 0x3fb8aa3b3fb8aa3b;
    local_9d0._0_4_ = auVar3._0_4_;
    local_9d0._4_4_ = auVar3._4_4_;
    uStack_9c8._0_4_ = auVar3._8_4_;
    uStack_9c8._4_4_ = auVar3._12_4_;
    local_ab0._4_4_ = local_9d0._4_4_ * 1.442695;
    local_ab0._0_4_ = (float)local_9d0 * 1.442695;
    uStack_aa8._0_4_ = (float)uStack_9c8 * 1.442695;
    uStack_aa8._4_4_ = uStack_9c8._4_4_ * 1.442695;
    local_a50 = local_ab0;
    uStack_a48 = uStack_aa8;
    local_ab0._0_4_ = (float)local_9d0 * 1.442695 + 0.5;
    local_ab0._4_4_ = local_9d0._4_4_ * 1.442695 + 0.5;
    fVar89 = (float)uStack_9c8 * 1.442695 + 0.5;
    fVar90 = uStack_9c8._4_4_ * 1.442695 + 0.5;
    uStack_aa8._0_4_ = fVar89;
    uStack_aa8._4_4_ = fVar90;
    local_720 = local_ab0;
    uStack_718 = uStack_aa8;
    local_ac0._4_4_ = (int)(float)local_ab0._4_4_;
    local_ac0._0_4_ = (int)(float)local_ab0._0_4_;
    local_ac0._8_4_ = (int)fVar89;
    local_ac0._12_4_ = (int)fVar90;
    local_700 = local_ac0._0_8_;
    uStack_6f8 = local_ac0._8_8_;
    auVar60._8_8_ = local_ac0._8_8_;
    auVar60._0_8_ = local_ac0._0_8_;
    auVar5 = vcvtdq2ps_avx(auVar60);
    local_aa0 = auVar5._0_8_;
    local_6e0 = local_aa0;
    uStack_a98 = auVar5._8_8_;
    uStack_6d8 = uStack_a98;
    local_6f0 = local_ab0;
    uStack_6e8 = uStack_aa8;
    auVar61._8_8_ = uStack_aa8;
    auVar61._0_8_ = local_ab0;
    auVar4 = vcmpps_avx(auVar61,auVar5,1);
    local_ae0._0_8_ = auVar4._0_8_;
    local_660 = local_ae0._0_8_;
    local_ae0._8_8_ = auVar4._8_8_;
    uStack_658 = local_ae0._8_8_;
    local_670 = 0x3f8000003f800000;
    uStack_668 = 0x3f8000003f800000;
    auVar64._8_8_ = 0x3f8000003f800000;
    auVar64._0_8_ = 0x3f8000003f800000;
    local_ae0 = vpand_avx(auVar4,auVar64);
    local_a30 = local_aa0;
    uStack_a28 = uStack_a98;
    local_a40 = local_ae0._0_8_;
    uStack_a38 = local_ae0._8_8_;
    _local_ab0 = vsubps_avx(auVar5,local_ae0);
    local_620 = local_ab0;
    local_610 = ::_ps_cephes_exp_C1;
    local_630 = local_a90;
    local_450 = local_ab0;
    uStack_448 = uStack_aa8;
    local_460[0] = 0.6933594;
    local_460[1] = 0.6933594;
    afStack_458[0] = 0.6933594;
    afStack_458[1] = 0.6933594;
    local_470 = local_a90;
    uStack_468 = uStack_a88;
    auVar65._8_4_ = 0.6933594;
    auVar65._12_4_ = 0.6933594;
    auVar65._0_4_ = 0.6933594;
    auVar65._4_4_ = 0.6933594;
    auVar4 = vfnmadd213ps_fma(auVar65,_local_ab0,auVar3);
    local_628 = ::_ps_cephes_exp_C2;
    local_420 = local_ab0;
    uStack_418 = uStack_aa8;
    local_430[0] = -0.00021219444;
    local_430[1] = -0.00021219444;
    afStack_428[0] = -0.00021219444;
    afStack_428[1] = -0.00021219444;
    local_a90 = auVar4._0_8_;
    local_440 = local_a90;
    uStack_a88 = auVar4._8_8_;
    uStack_438 = uStack_a88;
    auVar66._8_4_ = -0.00021219444;
    auVar66._12_4_ = -0.00021219444;
    auVar66._0_4_ = -0.00021219444;
    auVar66._4_4_ = -0.00021219444;
    _local_a90 = vfnmadd213ps_fma(auVar66,_local_ab0,auVar4);
    local_a00 = local_a90;
    uStack_9f8 = uStack_a88;
    local_9f0._0_4_ = local_a90._0_4_;
    local_9f0._4_4_ = local_a90._4_4_;
    uStack_9e8._0_4_ = local_a90._8_4_;
    uStack_9e8._4_4_ = local_a90._12_4_;
    local_aa0._4_4_ = local_9f0._4_4_ * local_9f0._4_4_;
    local_aa0._0_4_ = (float)local_9f0 * (float)local_9f0;
    uStack_a98._0_4_ = (float)uStack_9e8 * (float)uStack_9e8;
    uStack_a98._4_4_ = uStack_9e8._4_4_ * uStack_9e8._4_4_;
    uStack_ae8 = 0x3950696739506967;
    local_af0 = (undefined1  [8])0x3950696739506967;
    local_500 = local_af0;
    local_498 = ::_ps_cephes_exp_p1;
    local_3c0 = 0x3950696739506967;
    uStack_3b8 = 0x3950696739506967;
    local_3d0 = local_a90;
    uStack_3c8 = uStack_a88;
    local_3e0[0] = 0.0013981999;
    local_3e0[1] = 0.0013981999;
    afStack_3d8[0] = 0.0013981999;
    afStack_3d8[1] = 0.0013981999;
    auVar68._8_4_ = 0.0013981999;
    auVar68._12_4_ = 0.0013981999;
    auVar68._0_4_ = 0.0013981999;
    auVar68._4_4_ = 0.0013981999;
    auVar4 = vfmadd213ps_fma(_local_a90,_local_af0,auVar68);
    local_4b0 = ::_ps_cephes_exp_p2;
    local_af0 = auVar4._0_8_;
    local_390 = local_af0;
    uStack_ae8 = auVar4._8_8_;
    uStack_388 = uStack_ae8;
    local_3a0 = local_a90;
    uStack_398 = uStack_a88;
    local_3b0[0] = 0.008333452;
    local_3b0[1] = 0.008333452;
    afStack_3a8[0] = 0.008333452;
    afStack_3a8[1] = 0.008333452;
    auVar69._8_4_ = 0.008333452;
    auVar69._12_4_ = 0.008333452;
    auVar69._0_4_ = 0.008333452;
    auVar69._4_4_ = 0.008333452;
    auVar4 = vfmadd213ps_fma(_local_a90,auVar4,auVar69);
    local_4c8 = ::_ps_cephes_exp_p3;
    local_af0 = auVar4._0_8_;
    local_360 = local_af0;
    uStack_ae8 = auVar4._8_8_;
    uStack_358 = uStack_ae8;
    local_370 = local_a90;
    uStack_368 = uStack_a88;
    local_380[0] = 0.041665796;
    local_380[1] = 0.041665796;
    afStack_378[0] = 0.041665796;
    afStack_378[1] = 0.041665796;
    auVar70._8_4_ = 0.041665796;
    auVar70._12_4_ = 0.041665796;
    auVar70._0_4_ = 0.041665796;
    auVar70._4_4_ = 0.041665796;
    auVar4 = vfmadd213ps_fma(_local_a90,auVar4,auVar70);
    local_4e0 = ::_ps_cephes_exp_p4;
    local_af0 = auVar4._0_8_;
    local_330 = local_af0;
    uStack_ae8 = auVar4._8_8_;
    uStack_328 = uStack_ae8;
    local_340 = local_a90;
    uStack_338 = uStack_a88;
    local_350[0] = 0.16666666;
    local_350[1] = 0.16666666;
    afStack_348[0] = 0.16666666;
    afStack_348[1] = 0.16666666;
    auVar71._8_4_ = 0.16666666;
    auVar71._12_4_ = 0.16666666;
    auVar71._0_4_ = 0.16666666;
    auVar71._4_4_ = 0.16666666;
    auVar4 = vfmadd213ps_fma(_local_a90,auVar4,auVar71);
    local_4f8 = ::_ps_cephes_exp_p5;
    local_af0 = auVar4._0_8_;
    local_300 = local_af0;
    uStack_ae8 = auVar4._8_8_;
    uStack_2f8 = uStack_ae8;
    local_310 = local_a90;
    uStack_308 = uStack_a88;
    local_320[0] = 0.5;
    local_320[1] = 0.5;
    afStack_318[0] = 0.5;
    afStack_318[1] = 0.5;
    auVar72._8_4_ = 0.5;
    auVar72._12_4_ = 0.5;
    auVar72._0_4_ = 0.5;
    auVar72._4_4_ = 0.5;
    auVar4 = vfmadd213ps_fma(_local_a90,auVar4,auVar72);
    local_508 = local_aa0;
    local_af0 = auVar4._0_8_;
    local_2d0 = local_af0;
    uStack_ae8 = auVar4._8_8_;
    uStack_2c8 = uStack_ae8;
    local_2e0 = local_aa0;
    uStack_2d8 = uStack_a98;
    local_2f0 = local_a90;
    uStack_2e8 = uStack_a88;
    auVar4 = vfmadd213ps_fma(_local_aa0,auVar4,_local_a90);
    local_af0 = auVar4._0_8_;
    uVar14 = local_af0;
    uStack_ae8 = auVar4._8_8_;
    uVar15 = uStack_ae8;
    local_a80 = 0x3f8000003f800000;
    uStack_a78 = 0x3f8000003f800000;
    local_a70._0_4_ = auVar4._0_4_;
    local_a70._4_4_ = auVar4._4_4_;
    uStack_a68._0_4_ = auVar4._8_4_;
    uStack_a68._4_4_ = auVar4._12_4_;
    local_af0._4_4_ = local_a70._4_4_ + 1.0;
    local_af0._0_4_ = (float)local_a70 + 1.0;
    uStack_ae8._0_4_ = (float)uStack_a68 + 1.0;
    uStack_ae8._4_4_ = uStack_a68._4_4_ + 1.0;
    local_730._0_4_ = local_ab0._0_4_;
    local_730._4_4_ = local_ab0._4_4_;
    uStack_728._0_4_ = local_ab0._8_4_;
    uStack_728._4_4_ = local_ab0._12_4_;
    local_ac0._4_4_ = (int)local_730._4_4_;
    local_ac0._0_4_ = (int)(float)local_730;
    local_ac0._8_4_ = (int)(float)uStack_728;
    local_ac0._12_4_ = (int)uStack_728._4_4_;
    local_970 = local_ac0._0_8_;
    uStack_968 = local_ac0._8_8_;
    auVar55._8_8_ = local_ac0._8_8_;
    auVar55._0_8_ = local_ac0._0_8_;
    auVar54._8_8_ = 0x7f0000007f;
    auVar54._0_8_ = 0x7f0000007f;
    auVar4 = vpaddd_avx(auVar55,auVar54);
    local_ac0._0_8_ = auVar4._0_8_;
    local_950 = local_ac0._0_8_;
    local_ac0._8_8_ = auVar4._8_8_;
    uStack_948 = local_ac0._8_8_;
    local_954 = 0x17;
    local_ac0 = vpslld_avx(auVar4,ZEXT416(0x17));
    local_480 = local_ac0._0_8_;
    uStack_478 = local_ac0._8_8_;
    local_b00 = local_ac0._0_8_;
    uStack_af8 = local_ac0._8_8_;
    local_a10 = local_af0;
    uStack_a08 = uStack_ae8;
    local_a20._0_4_ = local_ac0._0_4_;
    local_a20._4_4_ = local_ac0._4_4_;
    uStack_a18._0_4_ = local_ac0._8_4_;
    uStack_a18._4_4_ = local_ac0._12_4_;
    local_af0._4_4_ = (local_a70._4_4_ + 1.0) * local_a20._4_4_;
    local_af0._0_4_ = ((float)local_a70 + 1.0) * (float)local_a20;
    uStack_ae8._0_4_ = ((float)uStack_a68 + 1.0) * (float)uStack_a18;
    uStack_ae8._4_4_ = (uStack_a68._4_4_ + 1.0) * uStack_a18._4_4_;
    local_2258 = local_22e8;
    local_2270 = local_af0;
    uStack_2268 = uStack_ae8;
    *(undefined1 (*) [8])local_22e8 = local_af0;
    *(undefined8 *)(local_22e8 + 2) = uStack_ae8;
    local_22e0 = (undefined1 (*) [32])(*local_22e0 + 0x10);
    local_22e8 = local_22e8 + 4;
    local_b30 = local_2390;
    uStack_b28 = uStack_2388;
    local_b20 = local_8c0;
    uStack_b18 = uStack_8b8;
    local_b10 = local_b40;
    uStack_b08 = uStack_b38;
    local_a70 = uVar14;
    uStack_a68 = uVar15;
    local_a20 = local_ac0._0_8_;
    uStack_a18 = local_ac0._8_8_;
    local_9f0 = local_a00;
    uStack_9e8 = uStack_9f8;
    local_9d0 = uVar12;
    uStack_9c8 = uVar13;
    local_8e0 = local_ad0;
    uStack_8d8 = uStack_ac8;
    local_8b0 = local_940;
    uStack_8a8 = uStack_938;
    local_890 = local_920._0_8_;
    uStack_888 = local_920._8_8_;
    local_880 = uVar8;
    uStack_878 = uVar9;
    local_860 = uVar6;
    uStack_858 = uVar7;
    local_7e0 = uVar10;
    uStack_7d8 = uVar11;
    local_7c0 = local_7d0;
    uStack_7b8 = uStack_7c8;
    local_7a0 = local_2390;
    uStack_798 = uStack_2388;
    local_770 = local_980;
    uStack_768 = uStack_978;
    local_730 = local_ab0;
    uStack_728 = uStack_aa8;
    local_618 = local_630;
    local_608 = local_620;
    local_5e8 = local_648;
    local_5d8 = local_5f0;
    local_5c8 = local_600;
    local_5c0 = local_648;
    local_5b0 = local_600;
    local_5a8 = local_648;
    local_598 = local_600;
    local_590 = local_648;
    local_580 = local_600;
    local_578 = local_648;
    local_568 = local_600;
    local_560 = local_648;
    local_550 = local_600;
    local_548 = local_648;
    local_538 = local_600;
    local_530 = local_648;
    local_520 = local_600;
    local_518 = local_648;
    local_510 = local_630;
    local_4f0 = local_630;
    local_4e8 = local_500;
    local_4d8 = local_630;
    local_4d0 = local_500;
    local_4c0 = local_630;
    local_4b8 = local_500;
    local_4a8 = local_630;
    local_4a0 = local_500;
    local_490 = local_630;
    local_488 = local_500;
    local_d0 = local_2390;
    uStack_c8 = uStack_2388;
    local_90 = local_a60;
    uStack_88 = uStack_a58;
  }
  for (; local_22fc < local_22ec; local_22fc = local_22fc + 1) {
    local_38 = local_22f1;
    local_40 = &local_22f8;
    local_48 = local_22e0;
    fVar89 = powf(*(float *)*local_22e0,local_22f8);
    *local_22e8 = fVar89;
    local_22e0 = (undefined1 (*) [32])(*local_22e0 + 4);
    local_22e8 = local_22e8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}